

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::avx::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  char *pcVar2;
  ushort uVar3;
  ushort uVar4;
  undefined4 uVar5;
  uint uVar6;
  size_t end;
  PrimRefVector pmVar7;
  PrimRefVector *ppmVar8;
  MemoryMonitorInterface *pMVar9;
  SubGridBuildData *pSVar10;
  PrimRefVector *ppmVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  BBox1f BVar20;
  BBox1f BVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  long lVar34;
  long lVar35;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  _Var36;
  char cVar37;
  size_t i_5;
  ThreadLocal2 *pTVar38;
  size_t sVar39;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar40;
  PrimRefMB *pPVar41;
  ulong uVar42;
  long lVar43;
  size_t sVar44;
  undefined8 *puVar45;
  runtime_error *prVar46;
  mvector<PrimRefMB> *prims;
  PrimRefVector pmVar47;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar48;
  float *pfVar49;
  range<unsigned_long> *prVar50;
  unsigned_long uVar51;
  int iVar52;
  undefined8 uVar53;
  undefined1 *puVar54;
  char *pcVar55;
  ThreadLocal2 *pTVar56;
  ulong uVar57;
  ulong uVar58;
  BBox1f BVar59;
  ulong uVar60;
  size_t i_7;
  ulong uVar61;
  SetMB *this_00;
  int iVar62;
  int iVar63;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar64;
  float fVar65;
  size_t i_9;
  bool bVar66;
  undefined1 auVar67 [8];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar119;
  undefined1 auVar120 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  uint x [4];
  BBox<embree::Vec3fa> blower1;
  uint primID [4];
  uint geomIDs [4];
  uint y [4];
  BBox3fa bounds0 [4];
  BBox<embree::Vec3fa> bupper0;
  vint vSplitPos;
  BBox3fa bounds1 [4];
  BBox<embree::Vec3fa> bi;
  BuildRecordSplit current;
  NodeRecordMB4D values [16];
  LocalChildListSplit children;
  task_group_context *in_stack_ffffffffffffe0c0;
  undefined1 local_1f30 [8];
  undefined8 uStack_1f28;
  ulong local_1f20;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1f18;
  undefined1 local_1f10 [16];
  float local_1f00;
  float fStack_1efc;
  float fStack_1ef8;
  float fStack_1ef4;
  ulong local_1ee8;
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  undefined1 local_1ed0 [8];
  undefined8 uStack_1ec8;
  undefined1 local_1ec0 [8];
  undefined8 uStack_1eb8;
  NodeRecordMB4D *local_1ea8;
  PrimRefMB *local_1ea0;
  ulong *local_1e98;
  undefined1 local_1e90 [8];
  undefined8 uStack_1e88;
  undefined1 local_1e80 [16];
  undefined1 local_1e70 [16];
  BinSplit<32UL> *local_1e58;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1e50;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1e48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e40;
  undefined8 local_1e30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e20;
  float local_1e10;
  float fStack_1e0c;
  float fStack_1e08;
  float fStack_1e04;
  undefined4 local_1e00;
  undefined4 uStack_1dfc;
  undefined4 uStack_1df8;
  undefined4 uStack_1df4;
  undefined4 uStack_1df0;
  undefined4 uStack_1dec;
  undefined4 uStack_1de8;
  undefined4 uStack_1de4;
  undefined4 local_1de0;
  undefined4 uStack_1ddc;
  undefined4 uStack_1dd8;
  undefined4 uStack_1dd4;
  undefined4 local_1dd0;
  undefined4 uStack_1dcc;
  undefined4 uStack_1dc8;
  undefined4 uStack_1dc4;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined4 local_1da0;
  undefined4 local_1d9c;
  undefined4 uStack_1d98;
  undefined4 local_1d94;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1d90;
  undefined1 local_1d80 [16];
  undefined1 local_1d70 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d20;
  size_t local_1d10;
  undefined1 local_1d00 [16];
  BBox1f local_1cf0;
  BBox1f local_1ce8;
  ulong local_1ce0;
  Geometry *local_1cd8;
  BBox1f local_1cd0;
  ulong local_1cc8;
  ulong local_1cc0;
  ulong local_1cb8;
  undefined1 local_1cb0 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ca0 [4];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c60 [2];
  size_t local_1c40;
  size_t local_1c38;
  BBox1f local_1c18;
  PrimRefVector local_1c10;
  ulong local_1c00 [2];
  size_t local_1bf0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1be0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aStack_1bd0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bc0;
  undefined8 local_1bb0;
  float fStack_1ba8;
  float fStack_1ba4;
  undefined4 local_1ba0;
  undefined4 uStack_1b9c;
  undefined4 uStack_1b98;
  undefined4 uStack_1b94;
  undefined4 local_1b90;
  undefined4 uStack_1b8c;
  undefined4 uStack_1b88;
  undefined4 uStack_1b84;
  undefined4 local_1b80;
  undefined4 uStack_1b7c;
  undefined4 uStack_1b78;
  undefined4 uStack_1b74;
  undefined4 local_1b70;
  undefined4 uStack_1b6c;
  undefined4 uStack_1b68;
  undefined4 uStack_1b64;
  long local_1b60;
  unsigned_long uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined4 local_1b40;
  undefined8 local_1b3c;
  undefined4 local_1b34;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b30;
  undefined1 *local_1b20;
  undefined1 *local_1b18;
  BuildRecordSplit local_1ab0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_19c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_19b0;
  undefined8 uStack_19a8;
  unsigned_long local_1960;
  unsigned_long local_1958;
  undefined1 local_1930 [240];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1840;
  float local_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1820;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aStack_1810;
  undefined4 local_1800 [4];
  undefined8 local_17f0;
  undefined4 uStack_17e8;
  undefined4 uStack_17e4;
  undefined4 local_17e0 [360];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1240;
  SetMB local_1230;
  undefined1 auStack_1190 [8];
  undefined1 auStack_1188 [3656];
  PrimRefVector *local_340 [16];
  ulong local_2c0;
  PrimRefVector local_2b8;
  PrimRefVector local_2b0 [63];
  long local_b8;
  
  local_1e70._8_8_ = local_1e70._0_8_;
  local_1240._0_8_ = in->depth;
  local_1ea8 = __return_storage_ptr__;
  if ((undefined8 *)(this->cfg).maxDepth < (ulong)local_1240._0_8_) {
    puVar45 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1240.field_1,"depth limit reached",(allocator *)&local_1840.field_1)
    ;
    *puVar45 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar45 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar45 + 2),(string *)&local_1240.field_1);
    __cxa_throw(puVar45,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  local_1d80._8_8_ = local_1d80._0_8_;
  local_1d80._0_8_ = in;
  SetMB::SetMB(&local_1230,&in->prims);
  findFallback((Split *)&local_1840.field_1,this,&in->prims);
  BuildRecord::BuildRecord((BuildRecord *)local_1930,(BuildRecord *)&local_1240.field_1);
  local_1930._176_8_ = local_1840._0_8_;
  pTVar38 = (ThreadLocal2 *)local_1930._112_8_;
  if (local_1930._0_8_ == 1) {
    if (local_1930._120_8_ == local_1930._112_8_) {
      fVar65 = 0.0;
      pTVar38 = (ThreadLocal2 *)local_1930._120_8_;
    }
    else {
      lVar43 = local_1930._112_8_ * 0x50 + 0x40;
      auVar73 = ZEXT816(0xff8000007f800000);
      for (pTVar56 = (ThreadLocal2 *)local_1930._112_8_; pTVar56 < (ulong)local_1930._120_8_;
          pTVar56 = (ThreadLocal2 *)((long)&(pTVar56->mutex).mutex + 1)) {
        auVar80._8_8_ = 0;
        auVar80._0_8_ =
             *(ulong *)((long)&((*(PrimRefMB **)(local_1930._160_8_ + 0x20))->lbounds).bounds0.lower
                               .field_0 + lVar43);
        auVar71 = vcmpps_avx(auVar73,auVar80,1);
        auVar81 = vinsertps_avx(auVar73,auVar80,0x50);
        auVar73 = vblendps_avx(auVar80,auVar73,2);
        auVar73 = vblendvps_avx(auVar73,auVar81,auVar71);
        lVar43 = lVar43 + 0x50;
      }
      auVar71 = vmovshdup_avx(auVar73);
      auVar71 = vcmpps_avx(auVar71,ZEXT416((uint)local_1930._156_4_),1);
      auVar73 = vcmpps_avx(ZEXT416((uint)local_1930._152_4_),auVar73,1);
      auVar73 = vorps_avx(auVar73,auVar71);
      fVar65 = (float)(auVar73._0_4_ & 0xffffff01);
    }
  }
  else {
    fVar65 = 0.0;
  }
  uVar61 = local_1930._120_8_ - (long)pTVar38;
  local_1ee8 = 1;
  if (((uVar61 <= (this->cfg).maxLeafSize) && ((uint)local_1840._12_4_ < 2)) &&
     (SUB41(fVar65,0) == '\0')) {
    local_1ea0 = *(PrimRefMB **)(local_1930._160_8_ + 0x20) + (long)pTVar38;
    pfVar49 = (*(PrimRefMB **)(local_1930._160_8_ + 0x20))[(long)pTVar38].lbounds.bounds0.lower.
              field_0.m128 + 3;
    local_1d50.m128[0] = *pfVar49;
    for (uVar42 = 1; uVar42 < uVar61; uVar42 = uVar42 + 1) {
      fVar65 = pfVar49[uVar42 * 0x14];
      uVar58 = 0;
      do {
        if (local_1ee8 == uVar58) {
          *(float *)((long)&local_1d50 + local_1ee8 * 4) = fVar65;
          local_1ee8 = (ulong)((int)local_1ee8 + 1);
          break;
        }
        lVar43 = uVar58 * 4;
        uVar58 = uVar58 + 1;
      } while (fVar65 != *(float *)((long)&local_1d50 + lVar43));
    }
    local_1ab0.super_BuildRecord.depth = (size_t)(local_1ee8 * 0x90);
    pTVar38 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar38->alloc)._M_b._M_p) {
      local_1840._8_1_ = 1;
      local_1840._0_8_ = pTVar38;
      MutexSys::lock(&pTVar38->mutex);
      if ((pTVar38->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar38->alloc1).bytesUsed + (pTVar38->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar38->alloc0).end + (pTVar38->alloc1).end) -
             ((pTVar38->alloc0).cur + (pTVar38->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar38->alloc1).bytesWasted + (pTVar38->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar75 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar38->alloc0).end = auVar75._0_8_;
      (pTVar38->alloc0).allocBlockSize = auVar75._8_8_;
      (pTVar38->alloc0).bytesUsed = auVar75._16_8_;
      (pTVar38->alloc0).bytesWasted = auVar75._24_8_;
      (pTVar38->alloc0).ptr = (char *)auVar75._0_8_;
      (pTVar38->alloc0).cur = auVar75._8_8_;
      (pTVar38->alloc0).end = auVar75._16_8_;
      (pTVar38->alloc0).allocBlockSize = auVar75._24_8_;
      auVar75 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar38->alloc1).end = auVar75._0_8_;
        (pTVar38->alloc1).allocBlockSize = auVar75._8_8_;
        (pTVar38->alloc1).bytesUsed = auVar75._16_8_;
        (pTVar38->alloc1).bytesWasted = auVar75._24_8_;
        (pTVar38->alloc1).ptr = (char *)auVar75._0_8_;
        (pTVar38->alloc1).cur = auVar75._8_8_;
        (pTVar38->alloc1).end = auVar75._16_8_;
        (pTVar38->alloc1).allocBlockSize = auVar75._24_8_;
      }
      else {
        (pTVar38->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar38->alloc1).ptr = (char *)auVar75._0_8_;
        (pTVar38->alloc1).cur = auVar75._8_8_;
        (pTVar38->alloc1).end = auVar75._16_8_;
        (pTVar38->alloc1).allocBlockSize = auVar75._24_8_;
        (pTVar38->alloc1).end = auVar75._0_8_;
        (pTVar38->alloc1).allocBlockSize = auVar75._8_8_;
        (pTVar38->alloc1).bytesUsed = auVar75._16_8_;
        (pTVar38->alloc1).bytesWasted = auVar75._24_8_;
        (pTVar38->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar38->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      local_1240._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      local_1240._8_1_ = 1;
      local_1cb0._0_8_ = pTVar38;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)local_1cb0);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_1240.field_1);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_1840.field_1);
    }
    (alloc.talloc1)->bytesUsed = local_1ab0.super_BuildRecord.depth + (alloc.talloc1)->bytesUsed;
    sVar44 = (alloc.talloc1)->cur;
    uVar42 = (ulong)(-(int)sVar44 & 0xf);
    uVar58 = local_1ab0.super_BuildRecord.depth + uVar42 + sVar44;
    (alloc.talloc1)->cur = uVar58;
    if ((alloc.talloc1)->end < uVar58) {
      (alloc.talloc1)->cur = sVar44;
      if ((undefined8 *)(alloc.talloc1)->allocBlockSize <
          (undefined8 *)(local_1ab0.super_BuildRecord.depth << 2)) {
        BVar59 = (BBox1f)FastAllocator::malloc(alloc.alloc,(size_t)&local_1ab0);
      }
      else {
        local_1240._0_8_ = (undefined8 *)(alloc.talloc1)->allocBlockSize;
        BVar59 = (BBox1f)FastAllocator::malloc(alloc.alloc,(size_t)&local_1240);
        (alloc.talloc1)->ptr = (char *)BVar59;
        sVar44 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar44;
        (alloc.talloc1)->end = local_1240._0_8_;
        (alloc.talloc1)->cur = local_1ab0.super_BuildRecord.depth;
        if ((ulong)local_1240._0_8_ < local_1ab0.super_BuildRecord.depth) {
          (alloc.talloc1)->cur = 0;
          local_1240._0_8_ = (alloc.talloc1)->allocBlockSize;
          BVar59 = (BBox1f)FastAllocator::malloc(alloc.alloc,(size_t)&local_1240);
          (alloc.talloc1)->ptr = (char *)BVar59;
          sVar44 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar44;
          (alloc.talloc1)->end = local_1240._0_8_;
          (alloc.talloc1)->cur = local_1ab0.super_BuildRecord.depth;
          if ((ulong)local_1240._0_8_ < local_1ab0.super_BuildRecord.depth) {
            (alloc.talloc1)->cur = 0;
            BVar59.lower = 0.0;
            BVar59.upper = 0.0;
            goto LAB_00d11fb2;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar44;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar42;
      BVar59 = (BBox1f)((uVar58 - local_1ab0.super_BuildRecord.depth) + (long)(alloc.talloc1)->ptr);
    }
LAB_00d11fb2:
    uVar42 = 7;
    if (local_1ee8 < 7) {
      uVar42 = local_1ee8;
    }
    local_1cf0 = (BBox1f)(uVar42 | (ulong)BVar59);
    local_1d80._8_4_ = 0x7f800000;
    local_1d80._0_8_ = 0x7f8000007f800000;
    local_1d80._12_4_ = 0x7f800000;
    local_1e70._8_4_ = 0xff800000;
    local_1e70._0_8_ = 0xff800000ff800000;
    local_1e70._12_4_ = 0xff800000;
    local_1e80._8_4_ = 0x7f800000;
    local_1e80._0_8_ = 0x7f8000007f800000;
    local_1e80._12_4_ = 0x7f800000;
    local_1d00._8_4_ = 0xff800000;
    local_1d00._0_8_ = 0xff800000ff800000;
    local_1d00._12_4_ = 0xff800000;
    local_1ce0 = uVar61;
    local_1ce8 = BVar59;
    pPVar41 = local_1ea0;
    for (local_1d70._16_8_ = 0; local_1d70._16_8_ != local_1ee8;
        local_1d70._16_8_ = local_1d70._16_8_ + 1) {
      local_1d70._24_8_ = ZEXT48(*(uint *)((long)&local_1d50 + local_1d70._16_8_ * 4));
      local_1cd8 = (((this->createLeaf).scene)->geometries).items[local_1d70._24_8_].ptr;
      local_1cb8 = 0;
      local_1cc8 = 0;
      auVar93 = ZEXT1664(ZEXT816(0) << 0x40);
      local_1cd0 = BVar59;
      while( true ) {
        if (local_1cc8 == uVar61) break;
        if (pPVar41[local_1cc8].lbounds.bounds0.lower.field_0.m128[3] == (float)local_1d70._24_8_) {
          pSVar10 = (this->createLeaf).sgrids;
          fVar65 = pPVar41[local_1cc8].lbounds.bounds0.upper.field_0.m128[3];
          uVar3 = pSVar10[(uint)fVar65].sx;
          local_1cc0 = local_1cb8;
          *(uint *)((long)&local_1e40 + local_1cb8 * 4) = (uint)uVar3;
          uVar4 = pSVar10[(uint)fVar65].sy;
          *(uint *)((long)&local_1d20 + local_1cb8 * 4) = (uint)uVar4;
          uVar6 = pSVar10[(uint)fVar65].primID;
          *(uint *)(local_1d70 + local_1cb8 * 4) = uVar6;
          local_1f10._8_8_ = (ulong)uVar3 & 0x7fff;
          local_1f10._0_8_ = (ulong)uVar4 & 0x7fff;
          local_1b30._8_8_ =
               (ulong)uVar6 *
               local_1cd8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i +
               *(long *)&local_1cd8->field_0x58;
          local_1b30._0_8_ = local_1cd8;
          local_1b20 = local_1f10 + 8;
          local_1b18 = local_1f10;
          fVar65 = local_1cd8->fnumTimeSegments;
          fVar12 = (local_1cd8->time_range).lower;
          local_1ee0 = (local_1cd8->time_range).upper - fVar12;
          fVar100 = ((float)local_1930._152_4_ - fVar12) / local_1ee0;
          local_1ee0 = ((float)local_1930._156_4_ - fVar12) / local_1ee0;
          local_1e98 = (ulong *)CONCAT44(local_1e98._4_4_,fVar100);
          fVar100 = fVar65 * fVar100;
          local_1ec0._0_4_ = fVar100;
          fVar12 = fVar65 * local_1ee0;
          auVar81 = vroundss_avx(ZEXT416((uint)fVar100),ZEXT416((uint)fVar100),9);
          auVar80 = vroundss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),10);
          auVar73 = vmaxss_avx(auVar81,auVar93._0_16_);
          local_1ed0._0_4_ = auVar73._0_4_;
          auVar71 = vminss_avx(auVar80,ZEXT416((uint)fVar65));
          iVar52 = (int)auVar73._0_4_;
          local_1e90._0_4_ = auVar71._0_4_;
          iVar63 = (int)auVar71._0_4_;
          local_1f00 = (float)(int)auVar81._0_4_;
          iVar62 = -1;
          if (-1 < (int)local_1f00) {
            iVar62 = (int)local_1f00;
          }
          local_1e58 = (BinSplit<32UL> *)CONCAT44(local_1e58._4_4_,fVar65);
          iVar15 = (int)fVar65 + 1;
          if ((int)auVar80._0_4_ < (int)fVar65 + 1) {
            iVar15 = (int)auVar80._0_4_;
          }
          GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                    ((BBox3fa *)&local_1240.field_1,(anon_class_32_4_e9707c6d *)&local_1b30.field_1,
                     (long)iVar52);
          GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                    ((BBox3fa *)&local_1840.field_1,(anon_class_32_4_e9707c6d *)&local_1b30.field_1,
                     (long)iVar63);
          if (iVar15 - iVar62 == 1) {
            auVar73 = vmaxss_avx(ZEXT416((uint)((float)local_1ec0._0_4_ - (float)local_1ed0._0_4_)),
                                 ZEXT816(0) << 0x40);
            auVar71 = vshufps_avx(auVar73,auVar73,0);
            auVar73 = ZEXT416((uint)(1.0 - auVar73._0_4_));
            auVar73 = vshufps_avx(auVar73,auVar73,0);
            auVar110._0_4_ = auVar71._0_4_ * local_1840.m128[0] + auVar73._0_4_ * local_1240.m128[0]
            ;
            auVar110._4_4_ = auVar71._4_4_ * local_1840.m128[1] + auVar73._4_4_ * local_1240.m128[1]
            ;
            auVar110._8_4_ = auVar71._8_4_ * local_1840.m128[2] + auVar73._8_4_ * local_1240.m128[2]
            ;
            auVar110._12_4_ =
                 auVar71._12_4_ * local_1840.m128[3] + auVar73._12_4_ * local_1240.m128[3];
            aVar121._0_4_ =
                 auVar71._0_4_ * local_1830 +
                 auVar73._0_4_ *
                 local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128[0];
            aVar121._4_4_ =
                 auVar71._4_4_ * fStack_182c +
                 auVar73._4_4_ *
                 local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128[1];
            aVar121._8_4_ =
                 auVar71._8_4_ * fStack_1828 +
                 auVar73._8_4_ *
                 local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128[2];
            aVar121._12_4_ =
                 auVar71._12_4_ * fStack_1824 +
                 auVar73._12_4_ *
                 local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128[3];
            auVar73 = vmaxss_avx(ZEXT416((uint)((float)local_1e90._0_4_ - fVar12)),
                                 ZEXT816(0) << 0x40);
            auVar71 = vshufps_avx(auVar73,auVar73,0);
            auVar73 = ZEXT416((uint)(1.0 - auVar73._0_4_));
            auVar73 = vshufps_avx(auVar73,auVar73,0);
            auVar78._0_4_ = auVar73._0_4_ * local_1840.m128[0] + auVar71._0_4_ * local_1240.m128[0];
            auVar78._4_4_ = auVar73._4_4_ * local_1840.m128[1] + auVar71._4_4_ * local_1240.m128[1];
            auVar78._8_4_ = auVar73._8_4_ * local_1840.m128[2] + auVar71._8_4_ * local_1240.m128[2];
            auVar78._12_4_ =
                 auVar73._12_4_ * local_1840.m128[3] + auVar71._12_4_ * local_1240.m128[3];
            aVar85._0_4_ = auVar73._0_4_ * local_1830 +
                           auVar71._0_4_ *
                           local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[0];
            aVar85._4_4_ = auVar73._4_4_ * fStack_182c +
                           auVar71._4_4_ *
                           local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[1];
            aVar85._8_4_ = auVar73._8_4_ * fStack_1828 +
                           auVar71._8_4_ *
                           local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[2];
            aVar85._12_4_ =
                 auVar73._12_4_ * fStack_1824 +
                 auVar71._12_4_ *
                 local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128[3];
          }
          else {
            local_1ec0._0_4_ = (float)local_1ec0._0_4_ - (float)local_1ed0._0_4_;
            GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                      ((BBox3fa *)&local_1e20.field_1,
                       (anon_class_32_4_e9707c6d *)&local_1b30.field_1,(long)(iVar52 + 1));
            GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                      ((BBox3fa *)&local_1bc0.field_1,
                       (anon_class_32_4_e9707c6d *)&local_1b30.field_1,(long)(iVar63 + -1));
            auVar73 = vmaxss_avx(ZEXT416((uint)local_1ec0._0_4_),ZEXT816(0) << 0x40);
            auVar71 = vshufps_avx(auVar73,auVar73,0);
            auVar73 = ZEXT416((uint)(1.0 - auVar73._0_4_));
            auVar73 = vshufps_avx(auVar73,auVar73,0);
            auVar110._0_4_ = auVar71._0_4_ * local_1e20.m128[0] + auVar73._0_4_ * local_1240.m128[0]
            ;
            auVar110._4_4_ = auVar71._4_4_ * local_1e20.m128[1] + auVar73._4_4_ * local_1240.m128[1]
            ;
            auVar110._8_4_ = auVar71._8_4_ * local_1e20.m128[2] + auVar73._8_4_ * local_1240.m128[2]
            ;
            auVar110._12_4_ =
                 auVar71._12_4_ * local_1e20.m128[3] + auVar73._12_4_ * local_1240.m128[3];
            aVar121._0_4_ =
                 auVar71._0_4_ * local_1e10 +
                 auVar73._0_4_ *
                 local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128[0];
            aVar121._4_4_ =
                 auVar71._4_4_ * fStack_1e0c +
                 auVar73._4_4_ *
                 local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128[1];
            aVar121._8_4_ =
                 auVar71._8_4_ * fStack_1e08 +
                 auVar73._8_4_ *
                 local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128[2];
            aVar121._12_4_ =
                 auVar71._12_4_ * fStack_1e04 +
                 auVar73._12_4_ *
                 local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128[3];
            auVar73 = vmaxss_avx(ZEXT416((uint)((float)local_1e90._0_4_ - fVar12)),
                                 ZEXT816(0) << 0x40);
            auVar71 = vshufps_avx(auVar73,auVar73,0);
            auVar73 = ZEXT416((uint)(1.0 - auVar73._0_4_));
            auVar73 = vshufps_avx(auVar73,auVar73,0);
            auVar78._0_4_ = auVar71._0_4_ * local_1bc0.m128[0] + auVar73._0_4_ * local_1840.m128[0];
            auVar78._4_4_ = auVar71._4_4_ * local_1bc0.m128[1] + auVar73._4_4_ * local_1840.m128[1];
            auVar78._8_4_ = auVar71._8_4_ * local_1bc0.m128[2] + auVar73._8_4_ * local_1840.m128[2];
            auVar78._12_4_ =
                 auVar71._12_4_ * local_1bc0.m128[3] + auVar73._12_4_ * local_1840.m128[3];
            aVar85._0_4_ = auVar71._0_4_ * (float)local_1bb0 + auVar73._0_4_ * local_1830;
            aVar85._4_4_ = auVar71._4_4_ * local_1bb0._4_4_ + auVar73._4_4_ * fStack_182c;
            aVar85._8_4_ = auVar71._8_4_ * fStack_1ba8 + auVar73._8_4_ * fStack_1828;
            aVar85._12_4_ = auVar71._12_4_ * fStack_1ba4 + auVar73._12_4_ * fStack_1824;
            if ((int)local_1f00 < 0) {
              local_1f00 = -NAN;
            }
            fVar65 = local_1ee0 - local_1e98._0_4_;
            sVar44 = (size_t)(int)local_1f00;
            while (sVar44 = sVar44 + 1, (long)sVar44 < (long)iVar15) {
              auVar74._0_4_ = ((float)(int)sVar44 / local_1e58._0_4_ - local_1e98._0_4_) / fVar65;
              auVar74._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar73 = vshufps_avx(auVar74,auVar74,0);
              local_1f30._0_4_ = auVar78._0_4_;
              local_1f30._4_4_ = auVar78._4_4_;
              uStack_1f28._0_4_ = auVar78._8_4_;
              uStack_1f28._4_4_ = auVar78._12_4_;
              auVar71 = vshufps_avx(ZEXT416((uint)(1.0 - auVar74._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar74._0_4_)),0);
              local_1ee0 = auVar73._0_4_ * (float)local_1f30._0_4_ + auVar110._0_4_ * auVar71._0_4_;
              fStack_1edc = auVar73._4_4_ * (float)local_1f30._4_4_ + auVar110._4_4_ * auVar71._4_4_
              ;
              fStack_1ed8 = auVar73._8_4_ * (float)uStack_1f28 + auVar110._8_4_ * auVar71._8_4_;
              fStack_1ed4 = auVar73._12_4_ * uStack_1f28._4_4_ + auVar110._12_4_ * auVar71._12_4_;
              local_1f00 = aVar85.m128[0] * auVar73._0_4_ + aVar121.m128[0] * auVar71._0_4_;
              fStack_1efc = aVar85.m128[1] * auVar73._4_4_ + aVar121.m128[1] * auVar71._4_4_;
              fStack_1ef8 = aVar85.m128[2] * auVar73._8_4_ + aVar121.m128[2] * auVar71._8_4_;
              fStack_1ef4 = aVar85.m128[3] * auVar73._12_4_ + aVar121.m128[3] * auVar71._12_4_;
              _local_1ed0 = aVar85;
              _local_1ec0 = aVar121;
              _local_1e90 = auVar110;
              GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                        ((BBox3fa *)&local_19c0.field_1,
                         (anon_class_32_4_e9707c6d *)&local_1b30.field_1,sVar44);
              auVar18._8_8_ = local_19c0._8_8_;
              auVar18._0_8_ = local_19c0._0_8_;
              auVar17._4_4_ = fStack_1edc;
              auVar17._0_4_ = local_1ee0;
              auVar17._8_4_ = fStack_1ed8;
              auVar17._12_4_ = fStack_1ed4;
              auVar73 = vsubps_avx(auVar18,auVar17);
              auVar19._8_8_ = uStack_19a8;
              auVar19._0_8_ = local_19b0;
              auVar16._4_4_ = fStack_1efc;
              auVar16._0_4_ = local_1f00;
              auVar16._8_4_ = fStack_1ef8;
              auVar16._12_4_ = fStack_1ef4;
              auVar81 = vsubps_avx(auVar19,auVar16);
              auVar71 = vminps_avx(auVar73,ZEXT816(0) << 0x40);
              auVar73 = vmaxps_avx(auVar81,ZEXT816(0) << 0x40);
              auVar110._0_4_ = (float)local_1e90._0_4_ + auVar71._0_4_;
              auVar110._4_4_ = (float)local_1e90._4_4_ + auVar71._4_4_;
              auVar110._8_4_ = (float)uStack_1e88 + auVar71._8_4_;
              auVar110._12_4_ = uStack_1e88._4_4_ + auVar71._12_4_;
              auVar78._0_4_ = (float)local_1f30._0_4_ + auVar71._0_4_;
              auVar78._4_4_ = (float)local_1f30._4_4_ + auVar71._4_4_;
              auVar78._8_4_ = (float)uStack_1f28 + auVar71._8_4_;
              auVar78._12_4_ = uStack_1f28._4_4_ + auVar71._12_4_;
              aVar121._0_4_ = (float)local_1ec0._0_4_ + auVar73._0_4_;
              aVar121._4_4_ = (float)local_1ec0._4_4_ + auVar73._4_4_;
              aVar121._8_4_ = (float)uStack_1eb8 + auVar73._8_4_;
              aVar121._12_4_ = uStack_1eb8._4_4_ + auVar73._12_4_;
              aVar85._0_4_ = (float)local_1ed0._0_4_ + auVar73._0_4_;
              aVar85._4_4_ = (float)local_1ed0._4_4_ + auVar73._4_4_;
              aVar85._8_4_ = (float)uStack_1ec8 + auVar73._8_4_;
              aVar85._12_4_ = uStack_1ec8._4_4_ + auVar73._12_4_;
            }
          }
          local_1d80 = vminps_avx(local_1d80,auVar110);
          local_1e70 = vmaxps_avx(local_1e70,(undefined1  [16])aVar121);
          local_1e80 = vminps_avx(local_1e80,auVar78);
          local_1d00 = vmaxps_avx(local_1d00,(undefined1  [16])aVar85);
          *(undefined1 (*) [16])(local_1cb0 + local_1cb8 * 0x20) = auVar110;
          local_1ca0[local_1cb8 * 2] = aVar121;
          *(undefined1 (*) [16])(&local_1ab0.super_BuildRecord.depth + local_1cb8 * 4) = auVar78;
          (&local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
            super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0)[local_1cb8].lower.
          field_0 = aVar85;
          local_1cb8 = (ulong)((int)local_1cc0 + 1);
          auVar93 = ZEXT864(0) << 0x40;
          pPVar41 = local_1ea0;
          BVar59 = local_1cd0;
          uVar61 = local_1ce0;
        }
        local_1cc8 = local_1cc8 + 1;
      }
      pcVar55 = (char *)(local_1d70._16_8_ * 0x90 + (long)local_1ce8);
      for (lVar43 = 0; lVar43 != 4; lVar43 = lVar43 + 1) {
        pcVar2 = (char *)((long)BVar59 + lVar43 * 8);
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = -1;
        pcVar2[5] = -1;
        pcVar2[6] = -1;
        pcVar2[7] = -1;
      }
      for (lVar43 = 0x30; lVar43 != 0x34; lVar43 = lVar43 + 1) {
        *(char *)((long)BVar59 + lVar43) = -1;
        ((char *)((long)BVar59 + -8))[lVar43] = -1;
        ((char *)((long)BVar59 + -0x10))[lVar43] = -1;
      }
      for (lVar43 = 0x34; lVar43 != 0x38; lVar43 = lVar43 + 1) {
        *(char *)((long)BVar59 + lVar43) = '\0';
        ((char *)((long)BVar59 + -8))[lVar43] = '\0';
        ((char *)((long)BVar59 + -0x10))[lVar43] = '\0';
      }
      for (lVar43 = 0x60; lVar43 != 100; lVar43 = lVar43 + 1) {
        *(char *)((long)BVar59 + lVar43) = -1;
        ((char *)((long)BVar59 + -8))[lVar43] = -1;
        ((char *)((long)BVar59 + -0x10))[lVar43] = -1;
      }
      for (lVar43 = 100; lVar43 != 0x68; lVar43 = lVar43 + 1) {
        *(char *)((long)BVar59 + lVar43) = '\0';
        ((char *)((long)BVar59 + -8))[lVar43] = '\0';
        ((char *)((long)BVar59 + -0x10))[lVar43] = '\0';
      }
      *(float *)(pcVar55 + 0x88) = (float)local_1d70._24_8_;
      *(undefined4 *)(pcVar55 + 0x80) = local_1930._152_4_;
      *(float *)(pcVar55 + 0x84) = 1.0 / ((float)local_1930._156_4_ - (float)local_1930._152_4_);
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
      field_0.m128[0] = INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
      field_0.m128[1] = INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
      field_0.m128[2] = INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
      field_0.m128[3] = INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
      upper.field_0.m128[0] = INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
      upper.field_0.m128[1] = INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
      upper.field_0.m128[2] = INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
      upper.field_0.m128[3] = INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
      upper.field_0.m128[0] = INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
      upper.field_0.m128[1] = INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
      upper.field_0.m128[2] = INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
      upper.field_0.m128[3] = INFINITY;
      local_1230.super_PrimInfoMB.object_range._begin._0_4_ = 0xff800000;
      local_1230.super_PrimInfoMB.object_range._begin._4_4_ = 0xff800000;
      local_1230.super_PrimInfoMB.object_range._end._0_4_ = 0xff800000;
      local_1230.super_PrimInfoMB.object_range._end._4_4_ = 0xff800000;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
      field_0.m128[0] = -INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
      field_0.m128[1] = -INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
      field_0.m128[2] = -INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
      field_0.m128[3] = -INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
      lower.field_0.m128[0] = -INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
      lower.field_0.m128[1] = -INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
      lower.field_0.m128[2] = -INFINITY;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
      lower.field_0.m128[3] = -INFINITY;
      for (lVar43 = 0; lVar43 != 4; lVar43 = lVar43 + 1) {
        *(undefined8 *)((long)&local_1240 + lVar43 * 8) = 8;
      }
      local_17e0[0] = 0x7f800000;
      local_17e0[1] = 0x7f800000;
      local_17e0[2] = 0x7f800000;
      local_17e0[3] = 0x7f800000;
      local_1800[0] = 0x7f800000;
      local_1800[1] = 0x7f800000;
      local_1800[2] = 0x7f800000;
      local_1800[3] = 0x7f800000;
      local_1820.i[0] = 0x7f800000;
      local_1820.i[1] = 0x7f800000;
      local_1820.i[2] = 0x7f800000;
      local_1820.i[3] = 0x7f800000;
      local_17e0[4] = 0xff800000;
      local_17e0[5] = 0xff800000;
      local_17e0[6] = 0xff800000;
      local_17e0[7] = 0xff800000;
      local_17f0._0_4_ = 0xff800000;
      local_17f0._4_4_ = 0xff800000;
      uStack_17e8 = 0xff800000;
      uStack_17e4 = 0xff800000;
      aStack_1810.i[0] = -0x800000;
      aStack_1810.i[1] = -0x800000;
      aStack_1810.i[2] = -0x800000;
      aStack_1810.i[3] = -0x800000;
      for (lVar43 = 0; lVar43 != 4; lVar43 = lVar43 + 1) {
        *(undefined8 *)((long)&local_1840 + lVar43 * 8) = 8;
      }
      for (lVar43 = 0; local_1cb8 << 2 != lVar43; lVar43 = lVar43 + 4) {
        *(ulong *)((long)BVar59 + lVar43 * 2) =
             CONCAT44(*(undefined4 *)(local_1d70 + lVar43),
                      *(int *)((long)&local_1d20 + lVar43) << 0x10 |
                      (uint)*(ushort *)((long)&local_1e40 + lVar43));
        uVar5 = *(undefined4 *)(local_1cb0 + lVar43 * 8 + 4);
        *(undefined4 *)((long)auStack_1190 + lVar43 + -0x90) =
             *(undefined4 *)(local_1cb0 + lVar43 * 8);
        *(undefined4 *)((long)auStack_1190 + lVar43 + -0x70) = uVar5;
        *(undefined4 *)((long)auStack_1190 + lVar43 + -0x50) =
             *(undefined4 *)(local_1cb0 + lVar43 * 8 + 8);
        *(undefined4 *)((long)auStack_1190 + lVar43 + -0x80) =
             *(undefined4 *)((long)local_1ca0 + lVar43 * 8);
        *(undefined4 *)((long)auStack_1190 + lVar43 + -0x60) =
             *(undefined4 *)((long)local_1ca0 + lVar43 * 8 + 4);
        *(undefined4 *)((long)auStack_1190 + lVar43 + -0x40) =
             *(undefined4 *)((long)local_1ca0 + lVar43 * 8 + 8);
        uVar5 = *(undefined4 *)((long)&local_1ab0.super_BuildRecord.depth + lVar43 * 8 + 4);
        *(int *)((long)&local_1820 + lVar43) = (int)(&local_1ab0.super_BuildRecord.depth)[lVar43];
        *(undefined4 *)((long)local_1800 + lVar43) = uVar5;
        *(undefined4 *)((long)local_17e0 + lVar43) =
             *(undefined4 *)(&local_1ab0.super_BuildRecord.field_0x8 + lVar43 * 8);
        *(undefined4 *)((long)&aStack_1810 + lVar43) =
             *(undefined4 *)
              ((long)&local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
                      super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0 + lVar43 * 8);
        *(undefined4 *)((long)&local_17f0 + lVar43) =
             *(undefined4 *)
              ((long)&local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
                      super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0 + lVar43 * 8 + 4);
        *(undefined4 *)((long)local_17e0 + lVar43 + 0x10) =
             *(undefined4 *)
              ((long)&local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
                      super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0 + lVar43 * 8 + 8);
      }
      auVar28._4_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.upper.field_0.m128[1];
      auVar28._0_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.upper.field_0.m128[0];
      auVar28._8_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.upper.field_0.m128[2];
      auVar28._12_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.upper.field_0.m128[3];
      auVar29._4_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0.m128[1];
      auVar29._0_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0.m128[0];
      auVar29._8_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0.m128[2];
      auVar29._12_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0.m128[3];
      auVar73 = vshufps_avx(auVar28,auVar28,0xb1);
      auVar73 = vminps_avx(auVar73,auVar28);
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      auVar70 = vminps_avx(auVar71,auVar73);
      auVar73 = vshufps_avx(auVar29,auVar29,0xb1);
      auVar73 = vmaxps_avx(auVar73,auVar29);
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      auVar73 = vmaxss_avx(auVar71,auVar73);
      fVar65 = (auVar73._0_4_ - auVar70._0_4_) * 1.0000002;
      auVar79 = ZEXT816(0) << 0x40;
      auVar73 = vcmpss_avx(auVar79,ZEXT416((uint)(fVar65 / 255.0)),0);
      auVar71 = vblendvps_avx(ZEXT416((uint)(fVar65 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar73)
      ;
      auVar73 = vcmpss_avx(auVar79,ZEXT416((uint)fVar65),1);
      auVar73 = vandps_avx(auVar73,ZEXT416((uint)(255.0 / fVar65)));
      auVar14 = vshufps_avx(auVar70,auVar70,0);
      auVar80 = vsubps_avx(auVar28,auVar14);
      auVar81 = vshufps_avx(auVar73,auVar73,0);
      auVar103._0_4_ = auVar80._0_4_ * auVar81._0_4_;
      auVar103._4_4_ = auVar80._4_4_ * auVar81._4_4_;
      auVar103._8_4_ = auVar80._8_4_ * auVar81._8_4_;
      auVar103._12_4_ = auVar80._12_4_ * auVar81._12_4_;
      auVar73 = vroundps_avx(auVar103,1);
      auVar73 = vcvtps2dq_avx(auVar73);
      auVar72 = vpmaxsd_avx(auVar73,(undefined1  [16])0x0);
      auVar73 = vsubps_avx(auVar29,auVar14);
      auVar86._0_4_ = auVar73._0_4_ * auVar81._0_4_;
      auVar86._4_4_ = auVar73._4_4_ * auVar81._4_4_;
      auVar86._8_4_ = auVar73._8_4_ * auVar81._8_4_;
      auVar86._12_4_ = auVar73._12_4_ * auVar81._12_4_;
      auVar73 = vroundps_avx(auVar86,2);
      auVar73 = vcvtps2dq_avx(auVar73);
      auVar129._8_4_ = 0xff;
      auVar129._0_8_ = 0xff000000ff;
      auVar129._12_4_ = 0xff;
      auVar13 = vpminsd_avx(auVar73,auVar129);
      auVar73 = vcvtdq2ps_avx(auVar72);
      auVar68 = vshufps_avx(auVar71,auVar71,0);
      auVar80 = vcvtdq2ps_avx(auVar13);
      auVar126._8_4_ = 0x7f800000;
      auVar126._0_8_ = 0x7f8000007f800000;
      auVar126._12_4_ = 0x7f800000;
      auVar81 = vcmpps_avx(auVar126,auVar28,4);
      auVar111._0_4_ = auVar14._0_4_ + auVar68._0_4_ * auVar73._0_4_;
      auVar111._4_4_ = auVar14._4_4_ + auVar68._4_4_ * auVar73._4_4_;
      auVar111._8_4_ = auVar14._8_4_ + auVar68._8_4_ * auVar73._8_4_;
      auVar111._12_4_ = auVar14._12_4_ + auVar68._12_4_ * auVar73._12_4_;
      auVar94._0_4_ = auVar68._0_4_ * auVar80._0_4_ + auVar14._0_4_;
      auVar94._4_4_ = auVar68._4_4_ * auVar80._4_4_ + auVar14._4_4_;
      auVar94._8_4_ = auVar68._8_4_ * auVar80._8_4_ + auVar14._8_4_;
      auVar94._12_4_ = auVar68._12_4_ * auVar80._12_4_ + auVar14._12_4_;
      auVar73 = vcmpps_avx(auVar111,auVar28,6);
      auVar73 = vpaddd_avx(auVar72,auVar73);
      auVar80 = vpmaxsd_avx(auVar73,(undefined1  [16])0x0);
      auVar73 = vcmpps_avx(auVar94,auVar29,1);
      auVar73 = vpsubd_avx(auVar13,auVar73);
      auVar72 = vpminsd_avx(auVar73,auVar129);
      auVar73 = vblendvps_avx(auVar129,auVar80,auVar81);
      auVar80 = vpackusdw_avx(auVar73,auVar73);
      auVar73 = vandps_avx(auVar81,auVar72);
      auVar73 = vpackusdw_avx(auVar73,auVar73);
      auVar73 = vpackuswb_avx(auVar80,auVar73);
      auVar73 = vpshufd_avx(auVar73,0xd8);
      *(long *)(pcVar55 + 0x20) = auVar73._0_8_;
      *(float *)(pcVar55 + 0x38) = auVar70._0_4_;
      *(int *)(pcVar55 + 0x44) = auVar71._0_4_;
      auVar30._4_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0.m128[1];
      auVar30._0_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0.m128[0];
      auVar30._8_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0.m128[2];
      auVar30._12_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0.m128[3];
      auVar31._4_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0.m128[1];
      auVar31._0_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0.m128[0];
      auVar31._8_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0.m128[2];
      auVar31._12_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0.m128[3];
      auVar73 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar73 = vminps_avx(auVar73,auVar30);
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      auVar70 = vminps_avx(auVar71,auVar73);
      auVar73 = vshufps_avx(auVar31,auVar31,0xb1);
      auVar73 = vmaxps_avx(auVar73,auVar31);
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      auVar73 = vmaxss_avx(auVar71,auVar73);
      fVar65 = (auVar73._0_4_ - auVar70._0_4_) * 1.0000002;
      auVar73 = vcmpss_avx(auVar79,ZEXT416((uint)(fVar65 / 255.0)),0);
      auVar71 = vblendvps_avx(ZEXT416((uint)(fVar65 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar73)
      ;
      auVar73 = vcmpss_avx(auVar79,ZEXT416((uint)fVar65),1);
      auVar73 = vandps_avx(auVar73,ZEXT416((uint)(255.0 / fVar65)));
      auVar14 = vshufps_avx(auVar70,auVar70,0);
      auVar80 = vsubps_avx(auVar30,auVar14);
      auVar81 = vshufps_avx(auVar73,auVar73,0);
      auVar104._0_4_ = auVar80._0_4_ * auVar81._0_4_;
      auVar104._4_4_ = auVar80._4_4_ * auVar81._4_4_;
      auVar104._8_4_ = auVar80._8_4_ * auVar81._8_4_;
      auVar104._12_4_ = auVar80._12_4_ * auVar81._12_4_;
      auVar73 = vroundps_avx(auVar104,1);
      auVar73 = vcvtps2dq_avx(auVar73);
      auVar72 = vpmaxsd_avx(auVar73,(undefined1  [16])0x0);
      auVar73 = vsubps_avx(auVar31,auVar14);
      auVar87._0_4_ = auVar73._0_4_ * auVar81._0_4_;
      auVar87._4_4_ = auVar73._4_4_ * auVar81._4_4_;
      auVar87._8_4_ = auVar73._8_4_ * auVar81._8_4_;
      auVar87._12_4_ = auVar73._12_4_ * auVar81._12_4_;
      auVar73 = vroundps_avx(auVar87,2);
      auVar73 = vcvtps2dq_avx(auVar73);
      auVar13 = vpminsd_avx(auVar73,auVar129);
      auVar73 = vcvtdq2ps_avx(auVar72);
      auVar68 = vshufps_avx(auVar71,auVar71,0);
      auVar80 = vcvtdq2ps_avx(auVar13);
      auVar134._8_4_ = 0x7f800000;
      auVar134._0_8_ = 0x7f8000007f800000;
      auVar134._12_4_ = 0x7f800000;
      auVar81 = vcmpps_avx(auVar134,auVar30,4);
      auVar112._0_4_ = auVar14._0_4_ + auVar68._0_4_ * auVar73._0_4_;
      auVar112._4_4_ = auVar14._4_4_ + auVar68._4_4_ * auVar73._4_4_;
      auVar112._8_4_ = auVar14._8_4_ + auVar68._8_4_ * auVar73._8_4_;
      auVar112._12_4_ = auVar14._12_4_ + auVar68._12_4_ * auVar73._12_4_;
      auVar95._0_4_ = auVar68._0_4_ * auVar80._0_4_ + auVar14._0_4_;
      auVar95._4_4_ = auVar68._4_4_ * auVar80._4_4_ + auVar14._4_4_;
      auVar95._8_4_ = auVar68._8_4_ * auVar80._8_4_ + auVar14._8_4_;
      auVar95._12_4_ = auVar68._12_4_ * auVar80._12_4_ + auVar14._12_4_;
      auVar73 = vcmpps_avx(auVar112,auVar30,6);
      auVar73 = vpaddd_avx(auVar72,auVar73);
      auVar80 = vpmaxsd_avx(auVar73,(undefined1  [16])0x0);
      auVar73 = vcmpps_avx(auVar95,auVar31,1);
      auVar73 = vpsubd_avx(auVar13,auVar73);
      auVar72 = vpminsd_avx(auVar73,auVar129);
      auVar73 = vblendvps_avx(auVar129,auVar80,auVar81);
      auVar80 = vpackusdw_avx(auVar73,auVar73);
      auVar73 = vandps_avx(auVar81,auVar72);
      auVar73 = vpackusdw_avx(auVar73,auVar73);
      auVar73 = vpackuswb_avx(auVar80,auVar73);
      auVar73 = vpshufd_avx(auVar73,0xd8);
      *(long *)(pcVar55 + 0x28) = auVar73._0_8_;
      *(float *)(pcVar55 + 0x3c) = auVar70._0_4_;
      *(int *)(pcVar55 + 0x48) = auVar71._0_4_;
      auVar32._4_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0.m128[1];
      auVar32._0_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0.m128[0];
      auVar32._8_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0.m128[2];
      auVar32._12_4_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0.m128[3];
      auVar33._4_4_ = local_1230.super_PrimInfoMB.object_range._begin._4_4_;
      auVar33._0_4_ = (undefined4)local_1230.super_PrimInfoMB.object_range._begin;
      auVar33._8_4_ = (undefined4)local_1230.super_PrimInfoMB.object_range._end;
      auVar33._12_4_ = local_1230.super_PrimInfoMB.object_range._end._4_4_;
      auVar73 = vshufps_avx(auVar32,auVar32,0xb1);
      auVar73 = vminps_avx(auVar73,auVar32);
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      auVar70 = vminps_avx(auVar71,auVar73);
      auVar73 = vshufps_avx(auVar33,auVar33,0xb1);
      auVar73 = vmaxps_avx(auVar73,auVar33);
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      auVar73 = vmaxss_avx(auVar71,auVar73);
      fVar65 = (auVar73._0_4_ - auVar70._0_4_) * 1.0000002;
      auVar73 = vcmpss_avx(auVar79,ZEXT416((uint)(fVar65 / 255.0)),0);
      auVar71 = vblendvps_avx(ZEXT416((uint)(fVar65 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar73)
      ;
      auVar73 = vcmpss_avx(auVar79,ZEXT416((uint)fVar65),1);
      auVar73 = vandps_avx(auVar73,ZEXT416((uint)(255.0 / fVar65)));
      auVar14 = vshufps_avx(auVar70,auVar70,0);
      auVar80 = vsubps_avx(auVar32,auVar14);
      auVar81 = vshufps_avx(auVar73,auVar73,0);
      auVar105._0_4_ = auVar80._0_4_ * auVar81._0_4_;
      auVar105._4_4_ = auVar80._4_4_ * auVar81._4_4_;
      auVar105._8_4_ = auVar80._8_4_ * auVar81._8_4_;
      auVar105._12_4_ = auVar80._12_4_ * auVar81._12_4_;
      auVar73 = vroundps_avx(auVar105,1);
      auVar73 = vcvtps2dq_avx(auVar73);
      auVar72 = vpmaxsd_avx(auVar73,(undefined1  [16])0x0);
      auVar73 = vsubps_avx(auVar33,auVar14);
      auVar88._0_4_ = auVar73._0_4_ * auVar81._0_4_;
      auVar88._4_4_ = auVar73._4_4_ * auVar81._4_4_;
      auVar88._8_4_ = auVar73._8_4_ * auVar81._8_4_;
      auVar88._12_4_ = auVar73._12_4_ * auVar81._12_4_;
      auVar73 = vroundps_avx(auVar88,2);
      auVar73 = vcvtps2dq_avx(auVar73);
      auVar13 = vpminsd_avx(auVar73,auVar129);
      auVar73 = vcvtdq2ps_avx(auVar72);
      auVar68 = vshufps_avx(auVar71,auVar71,0);
      auVar80 = vcvtdq2ps_avx(auVar13);
      auVar81 = vcmpps_avx(auVar134,auVar32,4);
      auVar113._0_4_ = auVar14._0_4_ + auVar68._0_4_ * auVar73._0_4_;
      auVar113._4_4_ = auVar14._4_4_ + auVar68._4_4_ * auVar73._4_4_;
      auVar113._8_4_ = auVar14._8_4_ + auVar68._8_4_ * auVar73._8_4_;
      auVar113._12_4_ = auVar14._12_4_ + auVar68._12_4_ * auVar73._12_4_;
      auVar96._0_4_ = auVar68._0_4_ * auVar80._0_4_ + auVar14._0_4_;
      auVar96._4_4_ = auVar68._4_4_ * auVar80._4_4_ + auVar14._4_4_;
      auVar96._8_4_ = auVar68._8_4_ * auVar80._8_4_ + auVar14._8_4_;
      auVar96._12_4_ = auVar68._12_4_ * auVar80._12_4_ + auVar14._12_4_;
      auVar73 = vcmpps_avx(auVar113,auVar32,6);
      auVar73 = vpaddd_avx(auVar72,auVar73);
      auVar80 = vpmaxsd_avx(auVar73,(undefined1  [16])0x0);
      auVar73 = vcmpps_avx(auVar96,auVar33,1);
      auVar73 = vpsubd_avx(auVar13,auVar73);
      auVar72 = vpminsd_avx(auVar73,auVar129);
      auVar73 = vblendvps_avx(auVar129,auVar80,auVar81);
      auVar80 = vpackusdw_avx(auVar73,auVar73);
      auVar73 = vandps_avx(auVar81,auVar72);
      auVar73 = vpackusdw_avx(auVar73,auVar73);
      auVar73 = vpackuswb_avx(auVar80,auVar73);
      auVar73 = vpshufd_avx(auVar73,0xd8);
      *(long *)(pcVar55 + 0x30) = auVar73._0_8_;
      *(float *)(pcVar55 + 0x40) = auVar70._0_4_;
      *(int *)(pcVar55 + 0x4c) = auVar71._0_4_;
      auVar22._4_4_ = local_1820.i[1];
      auVar22._0_4_ = local_1820.i[0];
      auVar22._8_4_ = local_1820.i[2];
      auVar22._12_4_ = local_1820.i[3];
      auVar23._4_4_ = aStack_1810.i[1];
      auVar23._0_4_ = aStack_1810.i[0];
      auVar23._8_4_ = aStack_1810.i[2];
      auVar23._12_4_ = aStack_1810.i[3];
      auVar73 = vshufps_avx(auVar22,auVar22,0xb1);
      auVar73 = vminps_avx(auVar73,auVar22);
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      auVar70 = vminps_avx(auVar71,auVar73);
      auVar73 = vshufps_avx(auVar23,auVar23,0xb1);
      auVar73 = vmaxps_avx(auVar73,auVar23);
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      auVar73 = vmaxss_avx(auVar71,auVar73);
      fVar65 = (auVar73._0_4_ - auVar70._0_4_) * 1.0000002;
      auVar73 = vcmpss_avx(auVar79,ZEXT416((uint)(fVar65 / 255.0)),0);
      auVar69 = SUB6416(ZEXT464(0x1000000),0);
      auVar71 = vblendvps_avx(ZEXT416((uint)(fVar65 / 255.0)),auVar69,auVar73);
      auVar73 = vcmpss_avx(auVar79,ZEXT416((uint)fVar65),1);
      auVar73 = vandps_avx(auVar73,ZEXT416((uint)(255.0 / fVar65)));
      auVar14 = vshufps_avx(auVar70,auVar70,0);
      auVar80 = vsubps_avx(auVar22,auVar14);
      auVar81 = vshufps_avx(auVar73,auVar73,0);
      auVar106._0_4_ = auVar80._0_4_ * auVar81._0_4_;
      auVar106._4_4_ = auVar80._4_4_ * auVar81._4_4_;
      auVar106._8_4_ = auVar80._8_4_ * auVar81._8_4_;
      auVar106._12_4_ = auVar80._12_4_ * auVar81._12_4_;
      auVar73 = vroundps_avx(auVar106,1);
      auVar73 = vcvtps2dq_avx(auVar73);
      auVar72 = vpmaxsd_avx(auVar73,(undefined1  [16])0x0);
      auVar73 = vsubps_avx(auVar23,auVar14);
      auVar89._0_4_ = auVar73._0_4_ * auVar81._0_4_;
      auVar89._4_4_ = auVar73._4_4_ * auVar81._4_4_;
      auVar89._8_4_ = auVar73._8_4_ * auVar81._8_4_;
      auVar89._12_4_ = auVar73._12_4_ * auVar81._12_4_;
      auVar73 = vroundps_avx(auVar89,2);
      auVar73 = vcvtps2dq_avx(auVar73);
      auVar13 = vpminsd_avx(auVar73,auVar129);
      auVar73 = vcvtdq2ps_avx(auVar72);
      auVar68 = vshufps_avx(auVar71,auVar71,0);
      auVar80 = vcvtdq2ps_avx(auVar13);
      auVar81 = vcmpps_avx(auVar134,auVar22,4);
      auVar114._0_4_ = auVar14._0_4_ + auVar68._0_4_ * auVar73._0_4_;
      auVar114._4_4_ = auVar14._4_4_ + auVar68._4_4_ * auVar73._4_4_;
      auVar114._8_4_ = auVar14._8_4_ + auVar68._8_4_ * auVar73._8_4_;
      auVar114._12_4_ = auVar14._12_4_ + auVar68._12_4_ * auVar73._12_4_;
      auVar97._0_4_ = auVar68._0_4_ * auVar80._0_4_ + auVar14._0_4_;
      auVar97._4_4_ = auVar68._4_4_ * auVar80._4_4_ + auVar14._4_4_;
      auVar97._8_4_ = auVar68._8_4_ * auVar80._8_4_ + auVar14._8_4_;
      auVar97._12_4_ = auVar68._12_4_ * auVar80._12_4_ + auVar14._12_4_;
      auVar73 = vcmpps_avx(auVar114,auVar22,6);
      auVar73 = vpaddd_avx(auVar72,auVar73);
      auVar80 = vpmaxsd_avx(auVar73,(undefined1  [16])0x0);
      auVar73 = vcmpps_avx(auVar97,auVar23,1);
      auVar73 = vpsubd_avx(auVar13,auVar73);
      auVar72 = vpminsd_avx(auVar73,auVar129);
      auVar73 = vblendvps_avx(auVar129,auVar80,auVar81);
      auVar80 = vpackusdw_avx(auVar73,auVar73);
      auVar73 = vandps_avx(auVar81,auVar72);
      auVar73 = vpackusdw_avx(auVar73,auVar73);
      auVar73 = vpackuswb_avx(auVar80,auVar73);
      auVar73 = vpshufd_avx(auVar73,0xd8);
      *(long *)(pcVar55 + 0x50) = auVar73._0_8_;
      *(float *)(pcVar55 + 0x68) = auVar70._0_4_;
      *(int *)(pcVar55 + 0x74) = auVar71._0_4_;
      auVar24._4_4_ = local_1800[1];
      auVar24._0_4_ = local_1800[0];
      auVar24._8_4_ = local_1800[2];
      auVar24._12_4_ = local_1800[3];
      auVar25._4_4_ = local_17f0._4_4_;
      auVar25._0_4_ = (undefined4)local_17f0;
      auVar25._8_4_ = uStack_17e8;
      auVar25._12_4_ = uStack_17e4;
      auVar73 = vshufps_avx(auVar24,auVar24,0xb1);
      auVar73 = vminps_avx(auVar73,auVar24);
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      auVar70 = vminps_avx(auVar71,auVar73);
      auVar73 = vshufps_avx(auVar25,auVar25,0xb1);
      auVar73 = vmaxps_avx(auVar73,auVar25);
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      auVar73 = vmaxss_avx(auVar71,auVar73);
      fVar65 = (auVar73._0_4_ - auVar70._0_4_) * 1.0000002;
      auVar73 = vcmpss_avx(auVar79,ZEXT416((uint)(fVar65 / 255.0)),0);
      auVar71 = vblendvps_avx(ZEXT416((uint)(fVar65 / 255.0)),auVar69,auVar73);
      auVar73 = vcmpss_avx(auVar79,ZEXT416((uint)fVar65),1);
      auVar73 = vandps_avx(auVar73,ZEXT416((uint)(255.0 / fVar65)));
      auVar14 = vshufps_avx(auVar70,auVar70,0);
      auVar80 = vsubps_avx(auVar24,auVar14);
      auVar81 = vshufps_avx(auVar73,auVar73,0);
      auVar107._0_4_ = auVar80._0_4_ * auVar81._0_4_;
      auVar107._4_4_ = auVar80._4_4_ * auVar81._4_4_;
      auVar107._8_4_ = auVar80._8_4_ * auVar81._8_4_;
      auVar107._12_4_ = auVar80._12_4_ * auVar81._12_4_;
      auVar73 = vroundps_avx(auVar107,1);
      auVar73 = vcvtps2dq_avx(auVar73);
      auVar72 = vpmaxsd_avx(auVar73,(undefined1  [16])0x0);
      auVar73 = vsubps_avx(auVar25,auVar14);
      auVar90._0_4_ = auVar73._0_4_ * auVar81._0_4_;
      auVar90._4_4_ = auVar73._4_4_ * auVar81._4_4_;
      auVar90._8_4_ = auVar73._8_4_ * auVar81._8_4_;
      auVar90._12_4_ = auVar73._12_4_ * auVar81._12_4_;
      auVar73 = vroundps_avx(auVar90,2);
      auVar73 = vcvtps2dq_avx(auVar73);
      auVar13 = vpminsd_avx(auVar73,auVar129);
      auVar73 = vcvtdq2ps_avx(auVar72);
      auVar68 = vshufps_avx(auVar71,auVar71,0);
      auVar80 = vcvtdq2ps_avx(auVar13);
      auVar81 = vcmpps_avx(auVar134,auVar24,4);
      auVar115._0_4_ = auVar14._0_4_ + auVar68._0_4_ * auVar73._0_4_;
      auVar115._4_4_ = auVar14._4_4_ + auVar68._4_4_ * auVar73._4_4_;
      auVar115._8_4_ = auVar14._8_4_ + auVar68._8_4_ * auVar73._8_4_;
      auVar115._12_4_ = auVar14._12_4_ + auVar68._12_4_ * auVar73._12_4_;
      auVar98._0_4_ = auVar68._0_4_ * auVar80._0_4_ + auVar14._0_4_;
      auVar98._4_4_ = auVar68._4_4_ * auVar80._4_4_ + auVar14._4_4_;
      auVar98._8_4_ = auVar68._8_4_ * auVar80._8_4_ + auVar14._8_4_;
      auVar98._12_4_ = auVar68._12_4_ * auVar80._12_4_ + auVar14._12_4_;
      auVar73 = vcmpps_avx(auVar115,auVar24,6);
      auVar73 = vpaddd_avx(auVar72,auVar73);
      auVar80 = vpmaxsd_avx(auVar73,(undefined1  [16])0x0);
      auVar73 = vcmpps_avx(auVar98,auVar25,1);
      auVar73 = vpsubd_avx(auVar13,auVar73);
      auVar72 = vpminsd_avx(auVar73,auVar129);
      auVar73 = vblendvps_avx(auVar129,auVar80,auVar81);
      auVar80 = vpackusdw_avx(auVar73,auVar73);
      auVar73 = vandps_avx(auVar81,auVar72);
      auVar73 = vpackusdw_avx(auVar73,auVar73);
      auVar73 = vpackuswb_avx(auVar80,auVar73);
      auVar73 = vpshufd_avx(auVar73,0xd8);
      *(long *)(pcVar55 + 0x58) = auVar73._0_8_;
      *(float *)(pcVar55 + 0x6c) = auVar70._0_4_;
      *(int *)(pcVar55 + 0x78) = auVar71._0_4_;
      auVar26._4_4_ = local_17e0[1];
      auVar26._0_4_ = local_17e0[0];
      auVar26._8_4_ = local_17e0[2];
      auVar26._12_4_ = local_17e0[3];
      auVar27._4_4_ = local_17e0[5];
      auVar27._0_4_ = local_17e0[4];
      auVar27._8_4_ = local_17e0[6];
      auVar27._12_4_ = local_17e0[7];
      auVar73 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar73 = vminps_avx(auVar73,auVar26);
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      auVar80 = vminps_avx(auVar71,auVar73);
      auVar73 = vshufps_avx(auVar27,auVar27,0xb1);
      auVar73 = vmaxps_avx(auVar73,auVar27);
      auVar71 = vshufpd_avx(auVar73,auVar73,1);
      auVar73 = vmaxss_avx(auVar71,auVar73);
      fVar65 = (auVar73._0_4_ - auVar80._0_4_) * 1.0000002;
      auVar73 = vcmpss_avx(auVar79,ZEXT416((uint)(fVar65 / 255.0)),0);
      auVar71 = vblendvps_avx(ZEXT416((uint)(fVar65 / 255.0)),auVar69,auVar73);
      auVar73 = vcmpss_avx(auVar79,ZEXT416((uint)fVar65),1);
      auVar73 = vandps_avx(auVar73,ZEXT416((uint)(255.0 / fVar65)));
      auVar13 = vshufps_avx(auVar80,auVar80,0);
      auVar70 = vsubps_avx(auVar26,auVar13);
      auVar81 = vshufps_avx(auVar73,auVar73,0);
      auVar108._0_4_ = auVar70._0_4_ * auVar81._0_4_;
      auVar108._4_4_ = auVar70._4_4_ * auVar81._4_4_;
      auVar108._8_4_ = auVar70._8_4_ * auVar81._8_4_;
      auVar108._12_4_ = auVar70._12_4_ * auVar81._12_4_;
      auVar73 = vroundps_avx(auVar108,1);
      auVar73 = vcvtps2dq_avx(auVar73);
      auVar70 = vpmaxsd_avx(auVar73,(undefined1  [16])0x0);
      auVar73 = vsubps_avx(auVar27,auVar13);
      auVar91._0_4_ = auVar73._0_4_ * auVar81._0_4_;
      auVar91._4_4_ = auVar73._4_4_ * auVar81._4_4_;
      auVar91._8_4_ = auVar73._8_4_ * auVar81._8_4_;
      auVar91._12_4_ = auVar73._12_4_ * auVar81._12_4_;
      auVar73 = vroundps_avx(auVar91,2);
      auVar73 = vcvtps2dq_avx(auVar73);
      auVar72 = vpminsd_avx(auVar73,auVar129);
      auVar73 = vcvtdq2ps_avx(auVar70);
      auVar14 = vshufps_avx(auVar71,auVar71,0);
      auVar81 = vcvtdq2ps_avx(auVar72);
      auVar116._0_4_ = auVar13._0_4_ + auVar14._0_4_ * auVar73._0_4_;
      auVar116._4_4_ = auVar13._4_4_ + auVar14._4_4_ * auVar73._4_4_;
      auVar116._8_4_ = auVar13._8_4_ + auVar14._8_4_ * auVar73._8_4_;
      auVar116._12_4_ = auVar13._12_4_ + auVar14._12_4_ * auVar73._12_4_;
      auVar99._0_4_ = auVar14._0_4_ * auVar81._0_4_ + auVar13._0_4_;
      auVar99._4_4_ = auVar14._4_4_ * auVar81._4_4_ + auVar13._4_4_;
      auVar99._8_4_ = auVar14._8_4_ * auVar81._8_4_ + auVar13._8_4_;
      auVar99._12_4_ = auVar14._12_4_ * auVar81._12_4_ + auVar13._12_4_;
      auVar73 = vcmpps_avx(auVar116,auVar26,6);
      auVar81 = vpaddd_avx(auVar70,auVar73);
      auVar73 = vcmpps_avx(auVar99,auVar27,1);
      auVar70 = vpsubd_avx(auVar72,auVar73);
      auVar73 = vcmpps_avx(auVar134,auVar26,4);
      auVar81 = vpmaxsd_avx(auVar81,(undefined1  [16])0x0);
      auVar70 = vpminsd_avx(auVar70,auVar129);
      auVar81 = vblendvps_avx(auVar129,auVar81,auVar73);
      auVar73 = vandps_avx(auVar73,auVar70);
      auVar81 = vpackusdw_avx(auVar81,auVar81);
      auVar73 = vpackusdw_avx(auVar73,auVar73);
      auVar73 = vpackuswb_avx(auVar81,auVar73);
      auVar73 = vpshufd_avx(auVar73,0xd8);
      *(long *)(pcVar55 + 0x60) = auVar73._0_8_;
      *(float *)(pcVar55 + 0x70) = auVar80._0_4_;
      *(int *)(pcVar55 + 0x7c) = auVar71._0_4_;
      BVar59 = (BBox1f)((long)BVar59 + 0x90);
    }
    (local_1ea8->ref).ptr = (ulong)local_1cf0 | 8;
    *(undefined8 *)&(local_1ea8->lbounds).bounds0.lower.field_0 = local_1d80._0_8_;
    *(undefined8 *)((long)&(local_1ea8->lbounds).bounds0.lower.field_0 + 8) = local_1d80._8_8_;
    *(undefined8 *)&(local_1ea8->lbounds).bounds0.upper.field_0 = local_1e70._0_8_;
    *(undefined8 *)((long)&(local_1ea8->lbounds).bounds0.upper.field_0 + 8) = local_1e70._8_8_;
    *(undefined8 *)&(local_1ea8->lbounds).bounds1.lower.field_0 = local_1e80._0_8_;
    *(undefined8 *)((long)&(local_1ea8->lbounds).bounds1.lower.field_0 + 8) = local_1e80._8_8_;
    *(undefined8 *)&(local_1ea8->lbounds).bounds1.upper.field_0 = local_1d00._0_8_;
    *(undefined8 *)((long)&(local_1ea8->lbounds).bounds1.upper.field_0 + 8) = local_1d00._8_8_;
    BVar20.upper = (float)local_1930._156_4_;
    BVar20.lower = (float)local_1930._152_4_;
    local_1ea8->dt = BVar20;
    return local_1ea8;
  }
  array_t<embree::avx::BVHBuilderMSMBlur::BuildRecordSplit,_16UL>::array_t
            ((array_t<embree::avx::BVHBuilderMSMBlur::BuildRecordSplit,_16UL> *)&local_1240.field_1)
  ;
  local_2c0 = 1;
  local_1f20 = 1;
  local_b8 = 1;
  BuildRecordSplit::operator=
            ((BuildRecordSplit *)&local_1240.field_1,(BuildRecordSplit *)local_1930);
  local_2b8 = (PrimRefVector)local_1930._160_8_;
  local_2b0[0] = (PrimRefVector)0x2;
  local_340[0] = &local_2b8;
  local_1e98 = local_1c00;
  local_1e58 = &local_1ab0.split;
  local_1e70._0_8_ = &this->heuristicTemporalSplit;
  uVar61 = 0;
  uStack_1e88._0_4_ = INFINITY;
  local_1e90 = (undefined1  [8])0x7f8000007f800000;
  uStack_1e88._4_4_ = INFINITY;
  uStack_1eb8._0_4_ = -INFINITY;
  local_1ec0 = (undefined1  [8])0xff800000ff800000;
  uStack_1eb8._4_4_ = -INFINITY;
  do {
    local_1ee0 = (float)uVar61;
    fStack_1edc = (float)(uVar61 >> 0x20);
    prVar50 = &local_1230.super_PrimInfoMB.object_range;
    uVar58 = 0;
    uVar42 = 0xffffffffffffffff;
    for (uVar57 = 0; local_2c0 != uVar57; uVar57 = uVar57 + 1) {
      uVar60 = prVar50->_end - prVar50->_begin;
      if ((((this->cfg).maxLeafSize < uVar60) || (1 < *(uint *)((long)(prVar50 + 4) + 0xc))) ||
         (((uint)fVar65 & 1) != 0)) {
        if (uVar58 < uVar60) {
          uVar42 = uVar57;
          uVar58 = uVar60;
        }
        fVar65 = 0.0;
      }
      prVar50 = prVar50 + 0xf;
    }
    if (uVar42 == 0xffffffffffffffff) break;
    local_1ed0._0_4_ = fVar65;
    local_1cb0._0_8_ = (ThreadLocal2 *)(local_1930._0_8_ + 1);
    local_1c00[0] = 0xffffffff7f800000;
    local_1c00[1]._0_4_ = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_1c00[1]._4_4_ = 0;
    local_1ab0.super_BuildRecord.depth = local_1930._0_8_ + 1;
    local_1ab0.split.sah = INFINITY;
    local_1ab0.split.dim = -1;
    local_1ab0.split.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_1ab0.split.data = 0;
    if (3 < (uint)((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190)->m128[uVar42 * 0x3c + 3])
    goto LAB_00d10dd5;
    this_00 = (SetMB *)((long)&local_1230 + uVar42 * 0xf0);
    switch(((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190)->m128[uVar42 * 0x3c + 3]) {
    case 0.0:
      local_19c0._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190 + uVar42 * 0xf;
      sVar44 = *(size_t *)
                ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190 + uVar42 * 0xf + -4);
      local_1e20._0_8_ = (ThreadLocal2 *)0x7f8000007f800000;
      local_1e20.m128[2] = INFINITY;
      local_1e20.m128[3] = INFINITY;
      local_1e10 = -INFINITY;
      fStack_1e0c = -INFINITY;
      fStack_1e08 = -INFINITY;
      fStack_1e04 = -INFINITY;
      local_1e00 = 0x7f800000;
      uStack_1dfc = 0x7f800000;
      uStack_1df8 = 0x7f800000;
      uStack_1df4 = 0x7f800000;
      uStack_1df0 = 0xff800000;
      uStack_1dec = 0xff800000;
      uStack_1de8 = 0xff800000;
      uStack_1de4 = 0xff800000;
      local_1de0 = 0x7f800000;
      uStack_1ddc = 0x7f800000;
      uStack_1dd8 = 0x7f800000;
      uStack_1dd4 = 0x7f800000;
      local_1dd0 = 0xff800000;
      uStack_1dcc = 0xff800000;
      uStack_1dc8 = 0xff800000;
      uStack_1dc4 = 0xff800000;
      local_1dc0 = 0;
      uStack_1db8 = 0;
      uStack_1db0 = 0;
      uStack_1da8 = 0;
      local_1da0 = 0;
      auVar81._8_4_ = 0x3f800000;
      auVar81._0_8_ = 0x3f8000003f800000;
      auVar81._12_4_ = 0x3f800000;
      uVar53 = vmovlps_avx(auVar81);
      local_1d9c = (undefined4)uVar53;
      uStack_1d98 = (undefined4)((ulong)uVar53 >> 0x20);
      local_1d94 = 0;
      end = *(size_t *)((long)auStack_1190 + uVar42 * 0xf0 + -0x38);
      local_1bc0._0_8_ = 0x7f8000007f800000;
      local_1bc0._8_8_ = (ThreadLocal2 *)0x7f8000007f800000;
      local_1bb0 = 0xff800000ff800000;
      fStack_1ba8 = -INFINITY;
      fStack_1ba4 = -INFINITY;
      local_1ba0 = 0x7f800000;
      uStack_1b9c = 0x7f800000;
      uStack_1b98 = 0x7f800000;
      uStack_1b94 = 0x7f800000;
      local_1b90 = 0xff800000;
      uStack_1b8c = 0xff800000;
      uStack_1b88 = 0xff800000;
      uStack_1b84 = 0xff800000;
      local_1b80 = 0x7f800000;
      uStack_1b7c = 0x7f800000;
      uStack_1b78 = 0x7f800000;
      uStack_1b74 = 0x7f800000;
      local_1b70 = 0xff800000;
      uStack_1b6c = 0xff800000;
      uStack_1b68 = 0xff800000;
      uStack_1b64 = 0xff800000;
      local_1b60 = 0;
      uStack_1b58 = 0;
      uStack_1b50 = 0;
      uStack_1b48 = 0;
      local_1b40 = 0;
      local_1b3c = vmovlps_avx(auVar81);
      local_1b34 = 0;
      local_1b30.m128[1] = (float)*(undefined4 *)((long)auStack_1190 + uVar42 * 0xf0 + 8);
      local_1b30._0_4_ = local_1b30.m128[1];
      local_1b30.m128[3] = local_1b30.m128[1];
      local_1b30._8_4_ = local_1b30.m128[1];
      lVar43 = (long)(1 << (*(byte *)&(&((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190)->
                                        field_1)[uVar42 * 0x14].y & 0x1f)) * 0x10;
      local_1d50._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar43);
      local_1d50._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar43 + 8);
      local_19c0._8_8_ = &local_1b30;
      local_19b0 = &local_1d50;
      sVar39 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                         (*(PrimRefMB **)
                           (*(long *)((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190 +
                                     uVar42 * 0xf + -1) + 0x20),sVar44,end,(EmptyTy *)local_1d70,
                          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1e20.field_1,
                          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1bc0.field_1,
                          (anon_class_24_3_c5d13451 *)&local_19c0.field_1,
                          (anon_class_1_0_00000001 *)&local_1e40.field_1,
                          (anon_class_1_0_00000001 *)&local_1d20.field_1,0x80,0xc00);
      pmVar47 = *(PrimRefVector *)
                 ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190 + uVar42 * 0xf + -1);
      uVar53 = *(undefined8 *)((long)auStack_1190 + uVar42 * 0xf0 + -0x18);
      local_1f00 = (float)uVar53;
      fStack_1efc = (float)((ulong)uVar53 >> 0x20);
      fStack_1ef8 = 0.0;
      fStack_1ef4 = 0.0;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1ca0[0].field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1e20.field_1);
      auVar68._8_8_ = 0;
      auVar68._0_4_ = local_1c18.lower;
      auVar68._4_4_ = local_1c18.upper;
      auVar13._4_4_ = fStack_1efc;
      auVar13._0_4_ = local_1f00;
      auVar13._8_4_ = fStack_1ef8;
      auVar13._12_4_ = fStack_1ef4;
      auVar71 = vcmpps_avx(auVar68,auVar13,1);
      auVar81 = vinsertps_avx(auVar13,auVar68,0x50);
      auVar73 = vblendps_avx(auVar68,auVar13,2);
      auVar73 = vblendvps_avx(auVar73,auVar81,auVar71);
      local_1c18 = (BBox1f)vmovlps_avx(auVar73);
      pmVar7 = *(PrimRefVector *)
                ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190 + uVar42 * 0xf + -1);
      uVar53 = *(undefined8 *)((long)auStack_1190 + uVar42 * 0xf0 + -0x18);
      local_1f00 = (float)uVar53;
      fStack_1efc = (float)((ulong)uVar53 >> 0x20);
      fStack_1ef8 = 0.0;
      fStack_1ef4 = 0.0;
      local_1c40 = sVar44;
      local_1c38 = sVar39;
      local_1c10 = pmVar47;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                (&local_1ab0.super_BuildRecord.prims.super_PrimInfoMB,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1bc0.field_1);
      auVar69._8_8_ = 0;
      auVar69._0_4_ = local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
      auVar69._4_4_ = local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
      auVar14._4_4_ = fStack_1efc;
      auVar14._0_4_ = local_1f00;
      auVar14._8_4_ = fStack_1ef8;
      auVar14._12_4_ = fStack_1ef4;
      auVar71 = vcmpps_avx(auVar69,auVar14,1);
      auVar81 = vinsertps_avx(auVar14,auVar69,0x50);
      auVar73 = vblendps_avx(auVar69,auVar14,2);
      auVar73 = vblendvps_avx(auVar73,auVar81,auVar71);
      local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.time_range = (BBox1f)vmovlps_avx(auVar73);
      local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin = sVar39;
      local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = end;
      local_1ab0.super_BuildRecord.prims.prims = pmVar7;
      break;
    case 1.4013e-45:
      SetMB::deterministic_order(this_00);
      splitFallback(this,this_00,(SetMB *)&local_1ca0[0].field_1,&local_1ab0.super_BuildRecord.prims
                   );
      break;
    case 2.8026e-45:
      local_1f10._12_4_ =
           ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190)->m128[uVar42 * 0x3c + 2];
      local_1f10._8_4_ = *(undefined4 *)((long)auStack_1190 + uVar42 * 0xf0 + -0x18);
      local_1f10._4_4_ = *(undefined4 *)((long)auStack_1190 + uVar42 * 0xf0 + -0x14);
      local_1f10._0_4_ =
           ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190)->m128[uVar42 * 0x3c + 2];
      local_1f00 = (float)*(undefined8 *)
                           ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190 +
                           uVar42 * 0xf + -1);
      fStack_1efc = (float)((ulong)*(undefined8 *)
                                    ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190 +
                                    uVar42 * 0xf + -1) >> 0x20);
      pvVar40 = (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                 *)::operator_new(0x28);
      pMVar9 = *(MemoryMonitorInterface **)local_1e70._0_8_;
      pvVar40->items = (PrimRefMB *)0x0;
      paVar48 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)
                 ((long)auStack_1190 + uVar42 * 0xf0 + -0x38);
      lVar43 = *(long *)((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190 + uVar42 * 0xf + -4);
      (pvVar40->alloc).device = pMVar9;
      (pvVar40->alloc).hugepages = false;
      pvVar40->size_active = 0;
      pvVar40->size_alloced = 0;
      sVar44 = (long)paVar48 - lVar43;
      paVar64 = paVar48;
      if (sVar44 != 0) {
        uVar61 = sVar44 * 0x50;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar61,0);
        if (uVar61 < 0x1c00000) {
          pPVar41 = (PrimRefMB *)alignedMalloc(uVar61,0x10);
        }
        else {
          pPVar41 = (PrimRefMB *)os_malloc(uVar61,&(pvVar40->alloc).hugepages);
        }
        pvVar40->items = pPVar41;
        pvVar40->size_active = sVar44;
        pvVar40->size_alloced = sVar44;
        paVar48 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)
                   ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190 + uVar42 * 0xf + -4);
        paVar64 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)
                   ((long)auStack_1190 + uVar42 * 0xf0 + -0x38);
      }
      local_1d50._0_8_ = CONCAT44(fStack_1efc,local_1f00);
      local_1d50._8_8_ = local_1f10 + 8;
      local_1d40._0_8_ = local_1e70._0_8_;
      local_1d40._8_8_ = &local_1e48;
      local_1e20._0_8_ = (undefined1 *)0x7f8000007f800000;
      local_1e20.m128[2] = INFINITY;
      local_1e20.m128[3] = INFINITY;
      local_1e10 = -INFINITY;
      fStack_1e0c = -INFINITY;
      fStack_1e08 = -INFINITY;
      fStack_1e04 = -INFINITY;
      local_1e00 = 0x7f800000;
      uStack_1dfc = 0x7f800000;
      uStack_1df8 = 0x7f800000;
      uStack_1df4 = 0x7f800000;
      uStack_1df0 = 0xff800000;
      uStack_1dec = 0xff800000;
      uStack_1de8 = 0xff800000;
      uStack_1de4 = 0xff800000;
      local_1de0 = 0x7f800000;
      uStack_1ddc = 0x7f800000;
      uStack_1dd8 = 0x7f800000;
      uStack_1dd4 = 0x7f800000;
      local_1dd0 = 0xff800000;
      uStack_1dcc = 0xff800000;
      uStack_1dc8 = 0xff800000;
      uStack_1dc4 = 0xff800000;
      local_1dc0 = 0;
      uStack_1db8 = 0;
      uStack_1db0 = 0;
      uStack_1da8 = 0;
      local_1da0 = 0;
      auVar73._8_4_ = 0x3f800000;
      auVar73._0_8_ = 0x3f8000003f800000;
      auVar73._12_4_ = 0x3f800000;
      uVar53 = vmovlps_avx(auVar73);
      local_1d9c = (undefined4)uVar53;
      uStack_1d98 = (undefined4)((ulong)uVar53 >> 0x20);
      local_1d94 = 0;
      local_1f18._M_head_impl = pvVar40;
      local_1e48._M_head_impl = pvVar40;
      local_1d30._0_8_ = this_00;
      if ((ulong)((long)paVar64 - (long)paVar48) < 0xc00) {
        local_19c0._0_8_ = paVar48;
        local_19c0._8_8_ = paVar64;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)&local_1bc0.field_1,(anon_class_40_5_808acc65 *)&local_1d50.field_1
                   ,(range<unsigned_long> *)&local_19c0.field_1);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&local_19c0.field_1,(context_traits)0x4,CUSTOM_CTX);
        local_1b20 = (undefined1 *)0x80;
        local_1e40._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1e40._8_8_ = &local_1d50;
        local_1b30._0_8_ = paVar64;
        local_1b30._8_8_ = paVar48;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1bc0.field_1,
                   (d1 *)&local_1b30.field_1,(blocked_range<unsigned_long> *)&local_1e20.field_1,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1e40.field_1,
                   (anon_class_16_2_ed117de8_conflict20 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&local_19c0,in_stack_ffffffffffffe0c0);
        cVar37 = tbb::detail::r1::is_group_execution_cancelled
                           ((task_group_context *)&local_19c0.field_1);
        if (cVar37 != '\0') {
          prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar46,"task cancelled");
          __cxa_throw(prVar46,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context
                  ((task_group_context *)&local_19c0.field_1);
      }
      uVar51 = *(long *)((long)auStack_1190 + uVar42 * 0xf0 + -0x38) -
               *(long *)((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190 + uVar42 * 0xf + -4);
      if (uStack_1b58 - local_1b60 != uVar51) {
        local_1e20._0_8_ = local_1f10 + 8;
        uStack_1b58 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                ((local_1e48._M_head_impl)->items,0,uVar51,0x400,
                                 (anon_class_8_1_41ce32a5 *)&local_1e20.field_1);
      }
      _Var36._M_head_impl = local_1e48._M_head_impl;
      local_1e80._8_8_ = 0;
      local_1e80._0_8_ = local_1f10._8_8_;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1e20.field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1bc0.field_1);
      local_1d90 = _Var36._M_head_impl;
      auVar70._4_4_ = local_1d94;
      auVar70._0_4_ = uStack_1d98;
      auVar70._8_8_ = 0;
      auVar71 = vcmpps_avx(auVar70,local_1e80,1);
      auVar81 = vinsertps_avx(local_1e80,auVar70,0x50);
      auVar73 = vblendps_avx(auVar70,local_1e80,2);
      auVar73 = vblendvps_avx(auVar73,auVar81,auVar71);
      uVar53 = vmovlps_avx(auVar73);
      uStack_1d98 = (undefined4)uVar53;
      local_1d94 = (undefined4)((ulong)uVar53 >> 0x20);
      SetMB::operator=((SetMB *)&local_1ca0[0].field_1,(SetMB *)&local_1e20.field_1);
      local_1d20._0_8_ = CONCAT44(fStack_1efc,local_1f00);
      local_1d20._8_8_ = local_1f10;
      local_1d10 = local_1e70._0_8_;
      paVar48 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)
                 ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190 + uVar42 * 0xf + -4);
      local_1e20._0_8_ = (ThreadLocal2 *)0x7f8000007f800000;
      local_1e20.m128[2] = INFINITY;
      local_1e20.m128[3] = INFINITY;
      local_1e10 = -INFINITY;
      fStack_1e0c = -INFINITY;
      fStack_1e08 = -INFINITY;
      fStack_1e04 = -INFINITY;
      local_1e00 = 0x7f800000;
      uStack_1dfc = 0x7f800000;
      uStack_1df8 = 0x7f800000;
      uStack_1df4 = 0x7f800000;
      uStack_1df0 = 0xff800000;
      uStack_1dec = 0xff800000;
      uStack_1de8 = 0xff800000;
      uStack_1de4 = 0xff800000;
      local_1de0 = 0x7f800000;
      uStack_1ddc = 0x7f800000;
      uStack_1dd8 = 0x7f800000;
      uStack_1dd4 = 0x7f800000;
      local_1dd0 = 0xff800000;
      uStack_1dcc = 0xff800000;
      uStack_1dc8 = 0xff800000;
      uStack_1dc4 = 0xff800000;
      local_1dc0 = 0;
      uStack_1db8 = 0;
      uStack_1db0 = 0;
      uStack_1da8 = 0;
      local_1da0 = 0;
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      uVar53 = vmovlps_avx(auVar71);
      local_1d9c = (undefined4)uVar53;
      uStack_1d98 = (undefined4)((ulong)uVar53 >> 0x20);
      local_1d94 = 0;
      paVar64 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)
                 ((long)auStack_1190 + uVar42 * 0xf0 + -0x38);
      if ((ulong)((long)paVar64 - (long)paVar48) < 0xc00) {
        local_1b30._0_8_ = paVar48;
        local_1b30._8_8_ = paVar64;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&local_19c0.field_1,(anon_class_24_3_35f68c7c *)&local_1d20.field_1
                   ,(range<unsigned_long> *)&local_1b30.field_1);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&local_1b30.field_1,(context_traits)0x4,CUSTOM_CTX);
        local_1e30 = 0x80;
        local_1d70._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1d70._8_8_ = &local_1d20;
        local_1e40._0_8_ = paVar64;
        local_1e40._8_8_ = paVar48;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_19c0.field_1,
                   (d1 *)&local_1e40.field_1,(blocked_range<unsigned_long> *)&local_1e20.field_1,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1d70,
                   (anon_class_16_2_ed117de8_conflict21 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&local_1b30,in_stack_ffffffffffffe0c0);
        cVar37 = tbb::detail::r1::is_group_execution_cancelled
                           ((task_group_context *)&local_1b30.field_1);
        if (cVar37 != '\0') {
          prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar46,"task cancelled");
          __cxa_throw(prVar46,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context
                  ((task_group_context *)&local_1b30.field_1);
      }
      lVar43 = local_1958 - local_1960;
      local_1960 = *(unsigned_long *)
                    ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)auStack_1190 + uVar42 * 0xf + -4);
      local_1958 = lVar43 + local_1960;
      uVar51 = *(unsigned_long *)((long)auStack_1190 + uVar42 * 0xf0 + -0x38);
      if (lVar43 != uVar51 - local_1960) {
        local_1e20._0_8_ = local_1f10;
        local_1958 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (*(PrimRefMB **)(CONCAT44(fStack_1efc,local_1f00) + 0x20),local_1960,
                                uVar51,0x400,(anon_class_8_1_41ce32a6 *)&local_1e20.field_1);
      }
      local_1e80._8_8_ = 0;
      local_1e80._0_8_ = local_1f10._0_8_;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1e20.field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_19c0.field_1);
      local_1d90 = (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                    *)CONCAT44(fStack_1efc,local_1f00);
      auVar72._4_4_ = local_1d94;
      auVar72._0_4_ = uStack_1d98;
      auVar72._8_8_ = 0;
      auVar71 = vcmpps_avx(auVar72,local_1e80,1);
      auVar81 = vinsertps_avx(local_1e80,auVar72,0x50);
      auVar73 = vblendps_avx(auVar72,local_1e80,2);
      auVar73 = vblendvps_avx(auVar73,auVar81,auVar71);
      uVar53 = vmovlps_avx(auVar73);
      uStack_1d98 = (undefined4)uVar53;
      local_1d94 = (undefined4)((ulong)uVar53 >> 0x20);
      SetMB::operator=(&local_1ab0.super_BuildRecord.prims,(SetMB *)&local_1e20.field_1);
      bVar66 = local_1f18._M_head_impl !=
               (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                *)0x0;
      goto LAB_00d10deb;
    case 4.2039e-45:
      SetMB::deterministic_order(this_00);
      splitByGeometry(this,this_00,(SetMB *)&local_1ca0[0].field_1,
                      &local_1ab0.super_BuildRecord.prims);
    }
LAB_00d10dd5:
    local_1f18._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    bVar66 = false;
LAB_00d10deb:
    findFallback((Split *)&local_1e20.field_1,this,(SetMB *)&local_1ca0[0].field_1);
    *local_1e98 = local_1e20._0_8_;
    local_1e98[1] = CONCAT44(local_1e20.m128[3],local_1e20.m128[2]);
    local_1bf0 = CONCAT44(fStack_1e0c,local_1e10);
    local_1be0._0_8_ = CONCAT44(uStack_1dfc,local_1e00);
    local_1be0._8_8_ = CONCAT44(uStack_1df4,uStack_1df8);
    aStack_1bd0._0_8_ = CONCAT44(uStack_1dec,uStack_1df0);
    aStack_1bd0._8_8_ = CONCAT44(uStack_1de4,uStack_1de8);
    findFallback((Split *)&local_1e20.field_1,this,&local_1ab0.super_BuildRecord.prims);
    lVar43 = local_b8;
    local_1e58->sah = (float)local_1e20._0_4_;
    local_1e58->dim = (int)local_1e20.m128[1];
    local_1e58->field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)local_1e20._8_4_;
    local_1e58->data = local_1e20._12_4_;
    local_1ab0.split.mapping.num = CONCAT44(fStack_1e0c,local_1e10);
    local_1ab0.split.mapping.ofs.field_0._0_8_ = CONCAT44(uStack_1dfc,local_1e00);
    local_1ab0.split.mapping.ofs.field_0._8_8_ = CONCAT44(uStack_1df4,uStack_1df8);
    local_1ab0.split.mapping.scale.field_0._0_8_ = CONCAT44(uStack_1dec,uStack_1df0);
    local_1ab0.split.mapping.scale.field_0._8_8_ = CONCAT44(uStack_1de4,uStack_1de8);
    local_1e50._M_head_impl = local_1f18._M_head_impl;
    local_1f18._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    ppmVar8 = local_340[uVar42];
    if (local_1c10 == *ppmVar8) {
      ppmVar8[1] = (PrimRefVector)((long)&(ppmVar8[1]->alloc).device + 1);
      pmVar47 = local_1c10;
    }
    else {
      lVar34 = local_b8 * 2;
      lVar35 = local_b8 * 2;
      local_b8 = local_b8 + 1;
      local_2b0[lVar35 + -1] = local_1c10;
      local_2b0[lVar43 * 2] = (PrimRefVector)0x1;
      local_340[uVar42] = local_2b0 + lVar34 + -1;
      pmVar47 = *ppmVar8;
    }
    lVar43 = local_b8;
    uVar53 = CONCAT44(fStack_1edc,local_1ee0);
    if (local_1ab0.super_BuildRecord.prims.prims == pmVar47) {
      local_340[local_2c0] = ppmVar8;
      pmVar47 = ppmVar8[1];
      ppmVar8[1] = (PrimRefVector)((long)&(pmVar47->alloc).device + 1);
    }
    else {
      lVar34 = local_b8 * 2;
      lVar35 = local_b8 * 2;
      local_b8 = local_b8 + 1;
      local_2b0[lVar35 + -1] = local_1ab0.super_BuildRecord.prims.prims;
      local_2b0[lVar43 * 2] = (PrimRefVector)0x1;
      local_340[local_2c0] = local_2b0 + lVar34 + -1;
      pmVar47 = (PrimRefVector)((long)&ppmVar8[1][-1].items + 7);
    }
    ppmVar8[1] = pmVar47;
    fVar65 = (float)local_1ed0._0_4_;
    if (pmVar47 == (PrimRefVector)0x0) {
      pmVar47 = *ppmVar8;
      if (pmVar47 != (PrimRefVector)0x0) {
        sVar44 = pmVar47->size_alloced;
        pPVar41 = pmVar47->items;
        if (pPVar41 != (PrimRefMB *)0x0) {
          if (sVar44 * 0x50 < 0x1c00000) {
            alignedFree(pPVar41);
          }
          else {
            os_free(pPVar41,sVar44 * 0x50,(pmVar47->alloc).hugepages);
          }
        }
        if (sVar44 != 0) {
          pMVar9 = (pmVar47->alloc).device;
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar44 * -0x50,1);
        }
        pmVar47->size_active = 0;
        pmVar47->size_alloced = 0;
        pmVar47->items = (PrimRefMB *)0x0;
        uVar53 = CONCAT44(fStack_1edc,local_1ee0);
      }
      ::operator_delete(pmVar47);
      fVar65 = (float)local_1ed0._0_4_;
    }
    local_1e50._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&(&local_1240)[uVar42 * 0xf].field_1,
               (BuildRecordSplit *)local_1cb0);
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&(&local_1240)[local_2c0 * 0xf].field_1,&local_1ab0);
    uVar61 = CONCAT71((int7)((ulong)uVar53 >> 8),(byte)uVar53 | bVar66);
    local_2c0 = local_2c0 + 1;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1e50);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1f18);
  } while (local_2c0 < (this->cfg).branchingFactor);
  paVar48 = &local_1240;
  pfVar49 = &local_1230.super_PrimInfoMB.time_range.upper;
  uVar42 = local_2c0;
  while( true ) {
    bVar66 = uVar42 == 0;
    uVar42 = uVar42 - 1;
    if (bVar66) break;
    auVar73 = vcmpps_avx(ZEXT416(*(uint *)(local_1d80._0_8_ + 0x98)),
                         ZEXT416((uint)((BBox1f *)(pfVar49 + -1))->lower),1);
    auVar71 = vcmpps_avx(ZEXT416((uint)*pfVar49),ZEXT416(*(uint *)(local_1d80._0_8_ + 0x9c)),1);
    auVar73 = vorps_avx(auVar73,auVar71);
    uVar61 = CONCAT71((int7)(uVar61 >> 8),(byte)uVar61 | auVar73[0]);
    pfVar49 = pfVar49 + 0x3c;
  }
  local_1ee0 = (float)uVar61;
  fStack_1edc = (float)(uVar61 >> 0x20);
  if ((uVar61 & 1) == 0) {
    local_1bc0._0_8_ = &DAT_000000e0;
    pTVar38 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar38->alloc)._M_b._M_p) {
      local_1ab0.super_BuildRecord._8_1_ = 1;
      local_1ab0.super_BuildRecord.depth = (size_t)pTVar38;
      MutexSys::lock(&pTVar38->mutex);
      if ((pTVar38->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar38->alloc1).bytesUsed + (pTVar38->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar38->alloc0).end + (pTVar38->alloc1).end) -
             ((pTVar38->alloc0).cur + (pTVar38->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar38->alloc1).bytesWasted + (pTVar38->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar75 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar38->alloc0).end = auVar75._0_8_;
      (pTVar38->alloc0).allocBlockSize = auVar75._8_8_;
      (pTVar38->alloc0).bytesUsed = auVar75._16_8_;
      (pTVar38->alloc0).bytesWasted = auVar75._24_8_;
      (pTVar38->alloc0).ptr = (char *)auVar75._0_8_;
      (pTVar38->alloc0).cur = auVar75._8_8_;
      (pTVar38->alloc0).end = auVar75._16_8_;
      (pTVar38->alloc0).allocBlockSize = auVar75._24_8_;
      auVar75 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar38->alloc1).end = auVar75._0_8_;
        (pTVar38->alloc1).allocBlockSize = auVar75._8_8_;
        (pTVar38->alloc1).bytesUsed = auVar75._16_8_;
        (pTVar38->alloc1).bytesWasted = auVar75._24_8_;
        (pTVar38->alloc1).ptr = (char *)auVar75._0_8_;
        (pTVar38->alloc1).cur = auVar75._8_8_;
        (pTVar38->alloc1).end = auVar75._16_8_;
        (pTVar38->alloc1).allocBlockSize = auVar75._24_8_;
      }
      else {
        (pTVar38->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar38->alloc1).ptr = (char *)auVar75._0_8_;
        (pTVar38->alloc1).cur = auVar75._8_8_;
        (pTVar38->alloc1).end = auVar75._16_8_;
        (pTVar38->alloc1).allocBlockSize = auVar75._24_8_;
        (pTVar38->alloc1).end = auVar75._0_8_;
        (pTVar38->alloc1).allocBlockSize = auVar75._8_8_;
        (pTVar38->alloc1).bytesUsed = auVar75._16_8_;
        (pTVar38->alloc1).bytesWasted = auVar75._24_8_;
        (pTVar38->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar38->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      local_1cb0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      local_1cb0[8] = 1;
      local_1e20._0_8_ = pTVar38;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&local_1e20);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_1cb0);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_1ab0);
    }
    (alloc.talloc0)->bytesUsed = (size_t)((alloc.talloc0)->bytesUsed + local_1bc0._0_8_);
    sVar44 = (alloc.talloc0)->cur;
    uVar61 = (ulong)(-(int)sVar44 & 0xf);
    puVar54 = (undefined1 *)(sVar44 + local_1bc0._0_8_) + uVar61;
    (alloc.talloc0)->cur = (size_t)puVar54;
    if ((undefined1 *)(alloc.talloc0)->end < puVar54) {
      (alloc.talloc0)->cur = sVar44;
      if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize < (ThreadLocal2 *)(local_1bc0._0_8_ << 2))
      {
        pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1bc0);
      }
      else {
        local_1cb0._0_8_ = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
        pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cb0);
        (alloc.talloc0)->ptr = pcVar55;
        sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar44;
        (alloc.talloc0)->end = local_1cb0._0_8_;
        (alloc.talloc0)->cur = local_1bc0._0_8_;
        if ((ulong)local_1cb0._0_8_ < (ulong)local_1bc0._0_8_) {
          (alloc.talloc0)->cur = 0;
          local_1cb0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cb0);
          (alloc.talloc0)->ptr = pcVar55;
          sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar44;
          (alloc.talloc0)->end = local_1cb0._0_8_;
          (alloc.talloc0)->cur = local_1bc0._0_8_;
          if ((ulong)local_1cb0._0_8_ < (ulong)local_1bc0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar55 = (char *)0x0;
            goto LAB_00d11bca;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar44;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar61;
      pcVar55 = (alloc.talloc0)->ptr + ((long)puVar54 - local_1bc0._0_8_);
    }
LAB_00d11bca:
    pcVar55[0x60] = '\0';
    pcVar55[0x61] = '\0';
    pcVar55[0x62] = -0x80;
    pcVar55[99] = '\x7f';
    pcVar55[100] = '\0';
    pcVar55[0x65] = '\0';
    pcVar55[0x66] = -0x80;
    pcVar55[0x67] = '\x7f';
    pcVar55[0x68] = '\0';
    pcVar55[0x69] = '\0';
    pcVar55[0x6a] = -0x80;
    pcVar55[0x6b] = '\x7f';
    pcVar55[0x6c] = '\0';
    pcVar55[0x6d] = '\0';
    pcVar55[0x6e] = -0x80;
    pcVar55[0x6f] = '\x7f';
    pcVar55[0x40] = '\0';
    pcVar55[0x41] = '\0';
    pcVar55[0x42] = -0x80;
    pcVar55[0x43] = '\x7f';
    pcVar55[0x44] = '\0';
    pcVar55[0x45] = '\0';
    pcVar55[0x46] = -0x80;
    pcVar55[0x47] = '\x7f';
    pcVar55[0x48] = '\0';
    pcVar55[0x49] = '\0';
    pcVar55[0x4a] = -0x80;
    pcVar55[0x4b] = '\x7f';
    pcVar55[0x4c] = '\0';
    pcVar55[0x4d] = '\0';
    pcVar55[0x4e] = -0x80;
    pcVar55[0x4f] = '\x7f';
    pcVar55[0x20] = '\0';
    pcVar55[0x21] = '\0';
    pcVar55[0x22] = -0x80;
    pcVar55[0x23] = '\x7f';
    pcVar55[0x24] = '\0';
    pcVar55[0x25] = '\0';
    pcVar55[0x26] = -0x80;
    pcVar55[0x27] = '\x7f';
    pcVar55[0x28] = '\0';
    pcVar55[0x29] = '\0';
    pcVar55[0x2a] = -0x80;
    pcVar55[0x2b] = '\x7f';
    pcVar55[0x2c] = '\0';
    pcVar55[0x2d] = '\0';
    pcVar55[0x2e] = -0x80;
    pcVar55[0x2f] = '\x7f';
    pcVar55[0x70] = '\0';
    pcVar55[0x71] = '\0';
    pcVar55[0x72] = -0x80;
    pcVar55[0x73] = -1;
    pcVar55[0x74] = '\0';
    pcVar55[0x75] = '\0';
    pcVar55[0x76] = -0x80;
    pcVar55[0x77] = -1;
    pcVar55[0x78] = '\0';
    pcVar55[0x79] = '\0';
    pcVar55[0x7a] = -0x80;
    pcVar55[0x7b] = -1;
    pcVar55[0x7c] = '\0';
    pcVar55[0x7d] = '\0';
    pcVar55[0x7e] = -0x80;
    pcVar55[0x7f] = -1;
    pcVar55[0x50] = '\0';
    pcVar55[0x51] = '\0';
    pcVar55[0x52] = -0x80;
    pcVar55[0x53] = -1;
    pcVar55[0x54] = '\0';
    pcVar55[0x55] = '\0';
    pcVar55[0x56] = -0x80;
    pcVar55[0x57] = -1;
    pcVar55[0x58] = '\0';
    pcVar55[0x59] = '\0';
    pcVar55[0x5a] = -0x80;
    pcVar55[0x5b] = -1;
    pcVar55[0x5c] = '\0';
    pcVar55[0x5d] = '\0';
    pcVar55[0x5e] = -0x80;
    pcVar55[0x5f] = -1;
    pcVar55[0x30] = '\0';
    pcVar55[0x31] = '\0';
    pcVar55[0x32] = -0x80;
    pcVar55[0x33] = -1;
    pcVar55[0x34] = '\0';
    pcVar55[0x35] = '\0';
    pcVar55[0x36] = -0x80;
    pcVar55[0x37] = -1;
    pcVar55[0x38] = '\0';
    pcVar55[0x39] = '\0';
    pcVar55[0x3a] = -0x80;
    pcVar55[0x3b] = -1;
    pcVar55[0x3c] = '\0';
    pcVar55[0x3d] = '\0';
    pcVar55[0x3e] = -0x80;
    pcVar55[0x3f] = -1;
    auVar73 = ZEXT816(0);
    *(undefined1 (*) [32])(pcVar55 + 0x80) = ZEXT1632(auVar73);
    *(undefined1 (*) [32])(pcVar55 + 0xa0) = ZEXT1632(auVar73);
    *(undefined1 (*) [32])(pcVar55 + 0xc0) = ZEXT1632(auVar73);
    for (lVar43 = 0; lVar43 != 4; lVar43 = lVar43 + 1) {
      pcVar2 = pcVar55 + lVar43 * 8;
      pcVar2[0] = '\b';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = '\0';
      pcVar2[5] = '\0';
      pcVar2[6] = '\0';
      pcVar2[7] = '\0';
    }
    goto LAB_00d11c2b;
  }
  local_1bc0._0_8_ = &DAT_00000100;
  pTVar38 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar38->alloc)._M_b._M_p) {
    local_1ab0.super_BuildRecord._8_1_ = 1;
    local_1ab0.super_BuildRecord.depth = (size_t)pTVar38;
    MutexSys::lock(&pTVar38->mutex);
    if ((pTVar38->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar38->alloc1).bytesUsed + (pTVar38->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar38->alloc0).end + (pTVar38->alloc1).end) -
           ((pTVar38->alloc0).cur + (pTVar38->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar38->alloc1).bytesWasted + (pTVar38->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar75 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar38->alloc0).end = auVar75._0_8_;
    (pTVar38->alloc0).allocBlockSize = auVar75._8_8_;
    (pTVar38->alloc0).bytesUsed = auVar75._16_8_;
    (pTVar38->alloc0).bytesWasted = auVar75._24_8_;
    (pTVar38->alloc0).ptr = (char *)auVar75._0_8_;
    (pTVar38->alloc0).cur = auVar75._8_8_;
    (pTVar38->alloc0).end = auVar75._16_8_;
    (pTVar38->alloc0).allocBlockSize = auVar75._24_8_;
    auVar75 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar38->alloc1).end = auVar75._0_8_;
      (pTVar38->alloc1).allocBlockSize = auVar75._8_8_;
      (pTVar38->alloc1).bytesUsed = auVar75._16_8_;
      (pTVar38->alloc1).bytesWasted = auVar75._24_8_;
      (pTVar38->alloc1).ptr = (char *)auVar75._0_8_;
      (pTVar38->alloc1).cur = auVar75._8_8_;
      (pTVar38->alloc1).end = auVar75._16_8_;
      (pTVar38->alloc1).allocBlockSize = auVar75._24_8_;
    }
    else {
      (pTVar38->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar38->alloc1).ptr = (char *)auVar75._0_8_;
      (pTVar38->alloc1).cur = auVar75._8_8_;
      (pTVar38->alloc1).end = auVar75._16_8_;
      (pTVar38->alloc1).allocBlockSize = auVar75._24_8_;
      (pTVar38->alloc1).end = auVar75._0_8_;
      (pTVar38->alloc1).allocBlockSize = auVar75._8_8_;
      (pTVar38->alloc1).bytesUsed = auVar75._16_8_;
      (pTVar38->alloc1).bytesWasted = auVar75._24_8_;
      (pTVar38->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar38->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_1cb0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    local_1cb0[8] = 1;
    local_1e20._0_8_ = pTVar38;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&local_1e20);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_1cb0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_1ab0);
  }
  (alloc.talloc0)->bytesUsed = (size_t)((alloc.talloc0)->bytesUsed + local_1bc0._0_8_);
  sVar44 = (alloc.talloc0)->cur;
  uVar61 = (ulong)(-(int)sVar44 & 0xf);
  puVar54 = (undefined1 *)(sVar44 + local_1bc0._0_8_) + uVar61;
  (alloc.talloc0)->cur = (size_t)puVar54;
  if ((undefined1 *)(alloc.talloc0)->end < puVar54) {
    (alloc.talloc0)->cur = sVar44;
    if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize < (ThreadLocal2 *)(local_1bc0._0_8_ << 2)) {
      pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1bc0);
    }
    else {
      local_1cb0._0_8_ = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
      pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cb0);
      (alloc.talloc0)->ptr = pcVar55;
      sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar44;
      (alloc.talloc0)->end = local_1cb0._0_8_;
      (alloc.talloc0)->cur = local_1bc0._0_8_;
      if ((ulong)local_1cb0._0_8_ < (ulong)local_1bc0._0_8_) {
        (alloc.talloc0)->cur = 0;
        local_1cb0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cb0);
        (alloc.talloc0)->ptr = pcVar55;
        sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar44;
        (alloc.talloc0)->end = local_1cb0._0_8_;
        (alloc.talloc0)->cur = local_1bc0._0_8_;
        if ((ulong)local_1cb0._0_8_ < (ulong)local_1bc0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar55 = (char *)0x0;
          goto LAB_00d11aa9;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar44;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar61;
    pcVar55 = (alloc.talloc0)->ptr + ((long)puVar54 - local_1bc0._0_8_);
  }
LAB_00d11aa9:
  pcVar55[0xe0] = '\0';
  pcVar55[0xe1] = '\0';
  pcVar55[0xe2] = -0x80;
  pcVar55[0xe3] = '\x7f';
  pcVar55[0xe4] = '\0';
  pcVar55[0xe5] = '\0';
  pcVar55[0xe6] = -0x80;
  pcVar55[0xe7] = '\x7f';
  pcVar55[0xe8] = '\0';
  pcVar55[0xe9] = '\0';
  pcVar55[0xea] = -0x80;
  pcVar55[0xeb] = '\x7f';
  pcVar55[0xec] = '\0';
  pcVar55[0xed] = '\0';
  pcVar55[0xee] = -0x80;
  pcVar55[0xef] = '\x7f';
  pcVar55[0xf0] = '\0';
  pcVar55[0xf1] = '\0';
  pcVar55[0xf2] = -0x80;
  pcVar55[0xf3] = -1;
  pcVar55[0xf4] = '\0';
  pcVar55[0xf5] = '\0';
  pcVar55[0xf6] = -0x80;
  pcVar55[0xf7] = -1;
  pcVar55[0xf8] = '\0';
  pcVar55[0xf9] = '\0';
  pcVar55[0xfa] = -0x80;
  pcVar55[0xfb] = -1;
  pcVar55[0xfc] = '\0';
  pcVar55[0xfd] = '\0';
  pcVar55[0xfe] = -0x80;
  pcVar55[0xff] = -1;
  pcVar55[0x60] = '\0';
  pcVar55[0x61] = '\0';
  pcVar55[0x62] = -0x80;
  pcVar55[99] = '\x7f';
  pcVar55[100] = '\0';
  pcVar55[0x65] = '\0';
  pcVar55[0x66] = -0x80;
  pcVar55[0x67] = '\x7f';
  pcVar55[0x68] = '\0';
  pcVar55[0x69] = '\0';
  pcVar55[0x6a] = -0x80;
  pcVar55[0x6b] = '\x7f';
  pcVar55[0x6c] = '\0';
  pcVar55[0x6d] = '\0';
  pcVar55[0x6e] = -0x80;
  pcVar55[0x6f] = '\x7f';
  pcVar55[0x40] = '\0';
  pcVar55[0x41] = '\0';
  pcVar55[0x42] = -0x80;
  pcVar55[0x43] = '\x7f';
  pcVar55[0x44] = '\0';
  pcVar55[0x45] = '\0';
  pcVar55[0x46] = -0x80;
  pcVar55[0x47] = '\x7f';
  pcVar55[0x48] = '\0';
  pcVar55[0x49] = '\0';
  pcVar55[0x4a] = -0x80;
  pcVar55[0x4b] = '\x7f';
  pcVar55[0x4c] = '\0';
  pcVar55[0x4d] = '\0';
  pcVar55[0x4e] = -0x80;
  pcVar55[0x4f] = '\x7f';
  pcVar55[0x20] = '\0';
  pcVar55[0x21] = '\0';
  pcVar55[0x22] = -0x80;
  pcVar55[0x23] = '\x7f';
  pcVar55[0x24] = '\0';
  pcVar55[0x25] = '\0';
  pcVar55[0x26] = -0x80;
  pcVar55[0x27] = '\x7f';
  pcVar55[0x28] = '\0';
  pcVar55[0x29] = '\0';
  pcVar55[0x2a] = -0x80;
  pcVar55[0x2b] = '\x7f';
  pcVar55[0x2c] = '\0';
  pcVar55[0x2d] = '\0';
  pcVar55[0x2e] = -0x80;
  pcVar55[0x2f] = '\x7f';
  pcVar55[0x70] = '\0';
  pcVar55[0x71] = '\0';
  pcVar55[0x72] = -0x80;
  pcVar55[0x73] = -1;
  pcVar55[0x74] = '\0';
  pcVar55[0x75] = '\0';
  pcVar55[0x76] = -0x80;
  pcVar55[0x77] = -1;
  pcVar55[0x78] = '\0';
  pcVar55[0x79] = '\0';
  pcVar55[0x7a] = -0x80;
  pcVar55[0x7b] = -1;
  pcVar55[0x7c] = '\0';
  pcVar55[0x7d] = '\0';
  pcVar55[0x7e] = -0x80;
  pcVar55[0x7f] = -1;
  pcVar55[0x50] = '\0';
  pcVar55[0x51] = '\0';
  pcVar55[0x52] = -0x80;
  pcVar55[0x53] = -1;
  pcVar55[0x54] = '\0';
  pcVar55[0x55] = '\0';
  pcVar55[0x56] = -0x80;
  pcVar55[0x57] = -1;
  pcVar55[0x58] = '\0';
  pcVar55[0x59] = '\0';
  pcVar55[0x5a] = -0x80;
  pcVar55[0x5b] = -1;
  pcVar55[0x5c] = '\0';
  pcVar55[0x5d] = '\0';
  pcVar55[0x5e] = -0x80;
  pcVar55[0x5f] = -1;
  pcVar55[0x30] = '\0';
  pcVar55[0x31] = '\0';
  pcVar55[0x32] = -0x80;
  pcVar55[0x33] = -1;
  pcVar55[0x34] = '\0';
  pcVar55[0x35] = '\0';
  pcVar55[0x36] = -0x80;
  pcVar55[0x37] = -1;
  pcVar55[0x38] = '\0';
  pcVar55[0x39] = '\0';
  pcVar55[0x3a] = -0x80;
  pcVar55[0x3b] = -1;
  pcVar55[0x3c] = '\0';
  pcVar55[0x3d] = '\0';
  pcVar55[0x3e] = -0x80;
  pcVar55[0x3f] = -1;
  auVar73 = ZEXT816(0);
  *(undefined1 (*) [32])(pcVar55 + 0x80) = ZEXT1632(auVar73);
  *(undefined1 (*) [32])(pcVar55 + 0xa0) = ZEXT1632(auVar73);
  *(undefined1 (*) [32])(pcVar55 + 0xc0) = ZEXT1632(auVar73);
  local_1f20 = 6;
  for (lVar43 = 0; lVar43 != 4; lVar43 = lVar43 + 1) {
    pcVar2 = pcVar55 + lVar43 * 8;
    pcVar2[0] = '\b';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
  }
LAB_00d11c2b:
  local_1f20 = local_1f20 | (ulong)pcVar55;
  puVar45 = &local_17f0;
  uStack_1f28._0_4_ = -INFINITY;
  local_1f30 = (undefined1  [8])0xff800000ff800000;
  uStack_1f28._4_4_ = -INFINITY;
  uStack_1ec8._0_4_ = INFINITY;
  local_1ed0 = (undefined1  [8])0x7f8000007f800000;
  uStack_1ec8._4_4_ = INFINITY;
  for (uVar61 = 0; uVar61 < local_2c0; uVar61 = uVar61 + 1) {
    createLargeLeaf((NodeRecordMB4D *)local_1cb0,this,(BuildRecord *)&paVar48->field_1,alloc);
    puVar45[-10] = local_1cb0._0_8_;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar45 + -8) = local_1ca0[0];
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar45 + -6) = local_1ca0[1];
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar45 + -4) = local_1ca0[2];
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar45 + -2) = local_1ca0[3];
    *puVar45 = local_1c60[0]._0_8_;
    _local_1ed0 = (__m128)vminps_avx(_local_1ed0,local_1ca0[0].m128);
    _local_1f30 = vmaxps_avx(_local_1f30,(undefined1  [16])local_1ca0[1]);
    _local_1e90 = vminps_avx(_local_1e90,(undefined1  [16])local_1ca0[2]);
    _local_1ec0 = (__m128)vmaxps_avx(_local_1ec0,local_1ca0[3].m128);
    paVar48 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(paVar48->m128 + 0x3c);
    puVar45 = puVar45 + 0xc;
  }
  uVar61 = (ulong)pcVar55 & 0xfffffffffffffff0;
  if (((uint)local_1f20 & 0xf) == 1) {
    pfVar49 = (float *)((long)&local_17f0 + 4);
    auVar77._8_4_ = 0x7f7fffff;
    auVar77._0_8_ = 0x7f7fffff7f7fffff;
    auVar77._12_4_ = 0x7f7fffff;
    auVar82._8_4_ = 0xff7fffff;
    auVar82._0_8_ = 0xff7fffffff7fffff;
    auVar82._12_4_ = 0xff7fffff;
    auVar84._8_4_ = 0x7fffffff;
    auVar84._0_8_ = 0x7fffffff7fffffff;
    auVar84._12_4_ = 0x7fffffff;
    for (uVar42 = 0; local_2c0 != uVar42; uVar42 = uVar42 + 1) {
      *(undefined8 *)(uVar61 + uVar42 * 8) = *(undefined8 *)(pfVar49 + -0x15);
      fVar65 = pfVar49[-1];
      fVar100 = 1.0 / (*pfVar49 - fVar65);
      fVar12 = -fVar65 * fVar100;
      auVar73 = vshufps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0);
      auVar71 = vshufps_avx(ZEXT416((uint)(1.0 - fVar12)),ZEXT416((uint)(1.0 - fVar12)),0);
      auVar133._0_4_ = pfVar49[-9] * auVar73._0_4_ + pfVar49[-0x11] * auVar71._0_4_;
      auVar133._4_4_ = pfVar49[-8] * auVar73._4_4_ + pfVar49[-0x10] * auVar71._4_4_;
      auVar133._8_4_ = pfVar49[-7] * auVar73._8_4_ + pfVar49[-0xf] * auVar71._8_4_;
      auVar133._12_4_ = pfVar49[-6] * auVar73._12_4_ + pfVar49[-0xe] * auVar71._12_4_;
      auVar117._0_4_ = pfVar49[-5] * auVar73._0_4_ + pfVar49[-0xd] * auVar71._0_4_;
      auVar117._4_4_ = pfVar49[-4] * auVar73._4_4_ + pfVar49[-0xc] * auVar71._4_4_;
      auVar117._8_4_ = pfVar49[-3] * auVar73._8_4_ + pfVar49[-0xb] * auVar71._8_4_;
      auVar117._12_4_ = pfVar49[-2] * auVar73._12_4_ + pfVar49[-10] * auVar71._12_4_;
      fVar100 = (1.0 - fVar65) * fVar100;
      auVar73 = vshufps_avx(ZEXT416((uint)fVar100),ZEXT416((uint)fVar100),0);
      auVar71 = vshufps_avx(ZEXT416((uint)(1.0 - fVar100)),ZEXT416((uint)(1.0 - fVar100)),0);
      auVar120._0_4_ = pfVar49[-9] * auVar73._0_4_ + pfVar49[-0x11] * auVar71._0_4_;
      auVar120._4_4_ = pfVar49[-8] * auVar73._4_4_ + pfVar49[-0x10] * auVar71._4_4_;
      auVar120._8_4_ = pfVar49[-7] * auVar73._8_4_ + pfVar49[-0xf] * auVar71._8_4_;
      auVar120._12_4_ = pfVar49[-6] * auVar73._12_4_ + pfVar49[-0xe] * auVar71._12_4_;
      auVar101._0_4_ = pfVar49[-5] * auVar73._0_4_ + pfVar49[-0xd] * auVar71._0_4_;
      auVar101._4_4_ = pfVar49[-4] * auVar73._4_4_ + pfVar49[-0xc] * auVar71._4_4_;
      auVar101._8_4_ = pfVar49[-3] * auVar73._8_4_ + pfVar49[-0xb] * auVar71._8_4_;
      auVar101._12_4_ = pfVar49[-2] * auVar73._12_4_ + pfVar49[-10] * auVar71._12_4_;
      auVar80 = vminps_avx(auVar133,auVar77);
      auVar71 = vmaxps_avx(auVar117,auVar82);
      auVar70 = vminps_avx(auVar120,auVar77);
      auVar81 = vmaxps_avx(auVar101,auVar82);
      auVar73 = vandps_avx(auVar80,auVar84);
      auVar124._0_4_ = auVar73._0_4_ * 4.7683716e-07;
      auVar124._4_4_ = auVar73._4_4_ * 4.7683716e-07;
      auVar124._8_4_ = auVar73._8_4_ * 4.7683716e-07;
      auVar124._12_4_ = auVar73._12_4_ * 4.7683716e-07;
      auVar80 = vsubps_avx(auVar80,auVar124);
      auVar73 = vandps_avx(auVar71,auVar84);
      auVar118._0_4_ = auVar71._0_4_ + auVar73._0_4_ * 4.7683716e-07;
      auVar118._4_4_ = auVar71._4_4_ + auVar73._4_4_ * 4.7683716e-07;
      auVar118._8_4_ = auVar71._8_4_ + auVar73._8_4_ * 4.7683716e-07;
      auVar118._12_4_ = auVar71._12_4_ + auVar73._12_4_ * 4.7683716e-07;
      auVar73 = vandps_avx(auVar70,auVar84);
      auVar125._0_4_ = auVar73._0_4_ * 4.7683716e-07;
      auVar125._4_4_ = auVar73._4_4_ * 4.7683716e-07;
      auVar125._8_4_ = auVar73._8_4_ * 4.7683716e-07;
      auVar125._12_4_ = auVar73._12_4_ * 4.7683716e-07;
      auVar71 = vsubps_avx(auVar70,auVar125);
      auVar73 = vandps_avx(auVar81,auVar84);
      *(int *)(uVar61 + 0x20 + uVar42 * 4) = auVar80._0_4_;
      uVar5 = vextractps_avx(auVar80,1);
      *(undefined4 *)(uVar61 + 0x40 + uVar42 * 4) = uVar5;
      auVar102._0_4_ = auVar73._0_4_ * 4.7683716e-07 + auVar81._0_4_;
      auVar102._4_4_ = auVar73._4_4_ * 4.7683716e-07 + auVar81._4_4_;
      auVar102._8_4_ = auVar73._8_4_ * 4.7683716e-07 + auVar81._8_4_;
      auVar102._12_4_ = auVar73._12_4_ * 4.7683716e-07 + auVar81._12_4_;
      uVar5 = vextractps_avx(auVar80,2);
      *(undefined4 *)(uVar61 + 0x60 + uVar42 * 4) = uVar5;
      *(float *)(uVar61 + 0x30 + uVar42 * 4) = auVar118._0_4_;
      uVar5 = vextractps_avx(auVar118,1);
      *(undefined4 *)(uVar61 + 0x50 + uVar42 * 4) = uVar5;
      auVar73 = vsubps_avx(auVar71,auVar80);
      uVar5 = vextractps_avx(auVar118,2);
      *(undefined4 *)(uVar61 + 0x70 + uVar42 * 4) = uVar5;
      *(int *)(uVar61 + 0x80 + uVar42 * 4) = auVar73._0_4_;
      uVar5 = vextractps_avx(auVar73,1);
      *(undefined4 *)(uVar61 + 0xa0 + uVar42 * 4) = uVar5;
      auVar71 = vsubps_avx(auVar102,auVar118);
      uVar5 = vextractps_avx(auVar73,2);
      *(undefined4 *)(uVar61 + 0xc0 + uVar42 * 4) = uVar5;
      *(int *)(uVar61 + 0x90 + uVar42 * 4) = auVar71._0_4_;
      uVar5 = vextractps_avx(auVar71,1);
      *(undefined4 *)(uVar61 + 0xb0 + uVar42 * 4) = uVar5;
      uVar5 = vextractps_avx(auVar71,2);
      *(undefined4 *)(uVar61 + 0xd0 + uVar42 * 4) = uVar5;
      pfVar49 = pfVar49 + 0x18;
    }
  }
  else {
    pfVar49 = (float *)((long)&local_17f0 + 4);
    auVar79._8_4_ = 0x7f7fffff;
    auVar79._0_8_ = 0x7f7fffff7f7fffff;
    auVar79._12_4_ = 0x7f7fffff;
    auVar83._8_4_ = 0xff7fffff;
    auVar83._0_8_ = 0xff7fffffff7fffff;
    auVar83._12_4_ = 0xff7fffff;
    auVar92._8_4_ = 0x7fffffff;
    auVar92._0_8_ = 0x7fffffff7fffffff;
    auVar92._12_4_ = 0x7fffffff;
    auVar109._8_4_ = 0x3f800001;
    auVar109._0_8_ = 0x3f8000013f800001;
    auVar109._12_4_ = 0x3f800001;
    for (uVar42 = 0; local_2c0 != uVar42; uVar42 = uVar42 + 1) {
      *(undefined8 *)(uVar61 + uVar42 * 8) = *(undefined8 *)(pfVar49 + -0x15);
      fVar65 = *pfVar49;
      fVar12 = pfVar49[-1];
      fVar119 = 1.0 / (fVar65 - fVar12);
      fVar100 = fVar119 * -fVar12;
      auVar73 = vshufps_avx(ZEXT416((uint)fVar100),ZEXT416((uint)fVar100),0);
      auVar71 = vshufps_avx(ZEXT416((uint)(1.0 - fVar100)),ZEXT416((uint)(1.0 - fVar100)),0);
      auVar76._0_4_ = pfVar49[-9] * auVar73._0_4_ + pfVar49[-0x11] * auVar71._0_4_;
      auVar76._4_4_ = pfVar49[-8] * auVar73._4_4_ + pfVar49[-0x10] * auVar71._4_4_;
      auVar76._8_4_ = pfVar49[-7] * auVar73._8_4_ + pfVar49[-0xf] * auVar71._8_4_;
      auVar76._12_4_ = pfVar49[-6] * auVar73._12_4_ + pfVar49[-0xe] * auVar71._12_4_;
      auVar127._0_4_ = pfVar49[-5] * auVar73._0_4_ + pfVar49[-0xd] * auVar71._0_4_;
      auVar127._4_4_ = pfVar49[-4] * auVar73._4_4_ + pfVar49[-0xc] * auVar71._4_4_;
      auVar127._8_4_ = pfVar49[-3] * auVar73._8_4_ + pfVar49[-0xb] * auVar71._8_4_;
      auVar127._12_4_ = pfVar49[-2] * auVar73._12_4_ + pfVar49[-10] * auVar71._12_4_;
      fVar119 = (1.0 - fVar12) * fVar119;
      auVar73 = vshufps_avx(ZEXT416((uint)fVar119),ZEXT416((uint)fVar119),0);
      auVar71 = vshufps_avx(ZEXT416((uint)(1.0 - fVar119)),ZEXT416((uint)(1.0 - fVar119)),0);
      auVar130._0_4_ = pfVar49[-9] * auVar73._0_4_ + pfVar49[-0x11] * auVar71._0_4_;
      auVar130._4_4_ = pfVar49[-8] * auVar73._4_4_ + pfVar49[-0x10] * auVar71._4_4_;
      auVar130._8_4_ = pfVar49[-7] * auVar73._8_4_ + pfVar49[-0xf] * auVar71._8_4_;
      auVar130._12_4_ = pfVar49[-6] * auVar73._12_4_ + pfVar49[-0xe] * auVar71._12_4_;
      auVar122._0_4_ = pfVar49[-5] * auVar73._0_4_ + pfVar49[-0xd] * auVar71._0_4_;
      auVar122._4_4_ = pfVar49[-4] * auVar73._4_4_ + pfVar49[-0xc] * auVar71._4_4_;
      auVar122._8_4_ = pfVar49[-3] * auVar73._8_4_ + pfVar49[-0xb] * auVar71._8_4_;
      auVar122._12_4_ = pfVar49[-2] * auVar73._12_4_ + pfVar49[-10] * auVar71._12_4_;
      auVar80 = vminps_avx(auVar76,auVar79);
      auVar71 = vmaxps_avx(auVar127,auVar83);
      auVar70 = vminps_avx(auVar130,auVar79);
      auVar81 = vmaxps_avx(auVar122,auVar83);
      auVar73 = vandps_avx(auVar80,auVar92);
      auVar131._0_4_ = auVar73._0_4_ * 4.7683716e-07;
      auVar131._4_4_ = auVar73._4_4_ * 4.7683716e-07;
      auVar131._8_4_ = auVar73._8_4_ * 4.7683716e-07;
      auVar131._12_4_ = auVar73._12_4_ * 4.7683716e-07;
      auVar80 = vsubps_avx(auVar80,auVar131);
      auVar73 = vandps_avx(auVar71,auVar92);
      auVar128._0_4_ = auVar71._0_4_ + auVar73._0_4_ * 4.7683716e-07;
      auVar128._4_4_ = auVar71._4_4_ + auVar73._4_4_ * 4.7683716e-07;
      auVar128._8_4_ = auVar71._8_4_ + auVar73._8_4_ * 4.7683716e-07;
      auVar128._12_4_ = auVar71._12_4_ + auVar73._12_4_ * 4.7683716e-07;
      auVar73 = vandps_avx(auVar70,auVar92);
      auVar132._0_4_ = auVar73._0_4_ * 4.7683716e-07;
      auVar132._4_4_ = auVar73._4_4_ * 4.7683716e-07;
      auVar132._8_4_ = auVar73._8_4_ * 4.7683716e-07;
      auVar132._12_4_ = auVar73._12_4_ * 4.7683716e-07;
      auVar71 = vsubps_avx(auVar70,auVar132);
      auVar73 = vandps_avx(auVar81,auVar92);
      *(int *)(uVar61 + 0x20 + uVar42 * 4) = auVar80._0_4_;
      uVar5 = vextractps_avx(auVar80,1);
      *(undefined4 *)(uVar61 + 0x40 + uVar42 * 4) = uVar5;
      auVar123._0_4_ = auVar81._0_4_ + auVar73._0_4_ * 4.7683716e-07;
      auVar123._4_4_ = auVar81._4_4_ + auVar73._4_4_ * 4.7683716e-07;
      auVar123._8_4_ = auVar81._8_4_ + auVar73._8_4_ * 4.7683716e-07;
      auVar123._12_4_ = auVar81._12_4_ + auVar73._12_4_ * 4.7683716e-07;
      uVar5 = vextractps_avx(auVar80,2);
      *(undefined4 *)(uVar61 + 0x60 + uVar42 * 4) = uVar5;
      *(float *)(uVar61 + 0x30 + uVar42 * 4) = auVar128._0_4_;
      uVar5 = vextractps_avx(auVar128,1);
      *(undefined4 *)(uVar61 + 0x50 + uVar42 * 4) = uVar5;
      auVar73 = vsubps_avx(auVar71,auVar80);
      uVar5 = vextractps_avx(auVar128,2);
      *(undefined4 *)(uVar61 + 0x70 + uVar42 * 4) = uVar5;
      *(int *)(uVar61 + 0x80 + uVar42 * 4) = auVar73._0_4_;
      uVar5 = vextractps_avx(auVar73,1);
      *(undefined4 *)(uVar61 + 0xa0 + uVar42 * 4) = uVar5;
      auVar71 = vsubps_avx(auVar123,auVar128);
      uVar5 = vextractps_avx(auVar73,2);
      *(undefined4 *)(uVar61 + 0xc0 + uVar42 * 4) = uVar5;
      *(int *)(uVar61 + 0x90 + uVar42 * 4) = auVar71._0_4_;
      uVar5 = vextractps_avx(auVar71,1);
      *(undefined4 *)(uVar61 + 0xb0 + uVar42 * 4) = uVar5;
      uVar5 = vextractps_avx(auVar71,2);
      *(undefined4 *)(uVar61 + 0xd0 + uVar42 * 4) = uVar5;
      auVar73 = vcmpss_avx(ZEXT416((uint)fVar65),SUB6416(ZEXT464(0x3f800000),0),0);
      auVar73 = vblendvps_avx(ZEXT416((uint)fVar65),auVar109,auVar73);
      *(float *)(uVar61 + 0xe0 + uVar42 * 4) = fVar12;
      *(int *)(uVar61 + 0xf0 + uVar42 * 4) = auVar73._0_4_;
      pfVar49 = pfVar49 + 0x18;
    }
  }
  if (((uint)local_1ee0 & 1) == 0) {
    (local_1ea8->ref).ptr = local_1f20;
    *(undefined1 (*) [8])&(local_1ea8->lbounds).bounds0.lower.field_0 = local_1ed0;
    *(char **)((long)&(local_1ea8->lbounds).bounds0.lower.field_0 + 8) = uStack_1ec8;
    *(undefined1 (*) [8])&(local_1ea8->lbounds).bounds0.upper.field_0 = local_1f30;
    *(undefined8 *)((long)&(local_1ea8->lbounds).bounds0.upper.field_0 + 8) = uStack_1f28;
    *(undefined1 (*) [8])&(local_1ea8->lbounds).bounds1.lower.field_0 = local_1e90;
    *(char **)((long)&(local_1ea8->lbounds).bounds1.lower.field_0 + 8) = uStack_1e88;
    auVar67 = local_1ec0;
    sVar44 = uStack_1eb8;
  }
  else {
    local_1b30._8_8_ = &this->recalculatePrimRef;
    local_1b30._0_8_ = local_1930 + 0x10;
    local_1ab0.super_BuildRecord.depth = 0x7f8000007f800000;
    local_1ab0.super_BuildRecord._8_4_ = 0x7f800000;
    local_1ab0.super_BuildRecord._12_4_ = 0x7f800000;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[0] =
         -INFINITY;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[1] =
         -INFINITY;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2] =
         -INFINITY;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3] =
         -INFINITY;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[0] =
         INFINITY;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[1] =
         INFINITY;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2] =
         INFINITY;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3] =
         INFINITY;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0] =
         -INFINITY;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1] =
         -INFINITY;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2] =
         -INFINITY;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3] =
         -INFINITY;
    if ((ulong)(local_1930._120_8_ - local_1930._112_8_) < 0xc00) {
      local_1cb0._0_8_ = local_1930._112_8_;
      local_1cb0._8_8_ = local_1930._120_8_;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&local_1e20.field_1,(anon_class_16_2_aeee9775 *)&local_1b30.field_1,
                 (range<unsigned_long> *)local_1cb0);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)local_1cb0,(context_traits)0x4,CUSTOM_CTX);
      local_1bc0._0_8_ = local_1930._120_8_;
      local_1bc0._8_8_ = local_1930._112_8_;
      local_1bb0 = 0x400;
      local_19c0._0_8_ = &local_1d50;
      local_19c0._8_8_ = &local_1b30;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&local_1e20.field_1,(d1 *)&local_1bc0.field_1,
                 (blocked_range<unsigned_long> *)&local_1ab0,
                 (LBBox<embree::Vec3fa> *)&local_19c0.field_1,
                 (anon_class_16_2_ed117de8_conflict22 *)local_19c0._0_8_,
                 (anon_class_1_0_00000001 *)local_1cb0,in_stack_ffffffffffffe0c0);
      cVar37 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_1cb0);
      if (cVar37 != '\0') {
        prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar46,"task cancelled");
        __cxa_throw(prVar46,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)local_1cb0);
    }
    (local_1ea8->ref).ptr = local_1f20;
    *(undefined8 *)&(local_1ea8->lbounds).bounds0.lower.field_0 = local_1e20._0_8_;
    *(ulong *)((long)&(local_1ea8->lbounds).bounds0.lower.field_0 + 8) =
         CONCAT44(local_1e20.m128[3],local_1e20.m128[2]);
    *(ulong *)&(local_1ea8->lbounds).bounds0.upper.field_0 = CONCAT44(fStack_1e0c,local_1e10);
    *(ulong *)((long)&(local_1ea8->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(fStack_1e04,fStack_1e08);
    *(ulong *)&(local_1ea8->lbounds).bounds1.lower.field_0 = CONCAT44(uStack_1dfc,local_1e00);
    *(ulong *)((long)&(local_1ea8->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(uStack_1df4,uStack_1df8);
    auVar67 = (undefined1  [8])CONCAT44(uStack_1dec,uStack_1df0);
    sVar44 = CONCAT44(uStack_1de4,uStack_1de8);
  }
  *(undefined1 (*) [8])&(local_1ea8->lbounds).bounds1.upper.field_0 = auVar67;
  *(size_t *)((long)&(local_1ea8->lbounds).bounds1.upper.field_0 + 8) = sVar44;
  BVar21.upper = (float)local_1930._156_4_;
  BVar21.lower = (float)local_1930._152_4_;
  local_1ea8->dt = BVar21;
  for (uVar61 = 0; uVar61 < local_2c0; uVar61 = uVar61 + 1) {
    ppmVar11 = local_340[uVar61];
    ppmVar8 = ppmVar11 + 1;
    *ppmVar8 = (PrimRefVector)((long)&(*ppmVar8)[-1].items + 7);
    if (*ppmVar8 == (PrimRefVector)0x0) {
      pmVar47 = *ppmVar11;
      if (pmVar47 != (PrimRefVector)0x0) {
        sVar44 = pmVar47->size_alloced;
        pPVar41 = pmVar47->items;
        if (pPVar41 != (PrimRefMB *)0x0) {
          if (sVar44 * 0x50 < 0x1c00000) {
            alignedFree(pPVar41);
          }
          else {
            os_free(pPVar41,sVar44 * 0x50,(pmVar47->alloc).hugepages);
          }
        }
        if (sVar44 != 0) {
          pMVar9 = (pmVar47->alloc).device;
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar44 * -0x50,1);
        }
        pmVar47->size_active = 0;
        pmVar47->size_alloced = 0;
        pmVar47->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pmVar47);
    }
  }
  return local_1ea8;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }